

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_avx::forward_inplace(BNLL_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  long *in_RSI;
  float fVar67;
  float fVar69;
  double dVar68;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  __m128 _x_1;
  __m128 _tmp_1;
  __m128 _abs_p_1;
  __m128 mask_3;
  __m128 _p_1;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp;
  __m256 _abs_p;
  __m256 mask;
  __m256 _p;
  __m256 _zero_avx;
  __m256 _one_avx;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 y_1;
  __m256 z;
  __m256 tmp_1;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_1;
  __m256i imm0_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask_1;
  __m256 one;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  v4sf y_3;
  v4sf z_1;
  v4sf tmp_3;
  v4sf mask_5;
  v4sf e_1;
  v4sf invalid_mask_1;
  v4sf one_3;
  v4si emm0_1;
  v4sf pow2n_1;
  v4sf y_2;
  v4sf mask_4;
  v4sf one_2;
  v4si emm0;
  v4sf fx_1;
  v4sf tmp_2;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  imm_xmm_union u_7;
  __m256i ret_3;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  undefined8 local_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 local_31b0;
  undefined8 uStack_31a8;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined4 uStack_30f4;
  undefined4 uStack_30f0;
  undefined4 uStack_30ec;
  undefined4 uStack_30e8;
  undefined4 uStack_30e4;
  int local_3098;
  undefined8 local_3088;
  undefined8 local_3080;
  undefined8 local_3078;
  undefined4 local_3070;
  long local_3068;
  undefined4 local_3060;
  undefined4 local_305c;
  undefined4 local_3058;
  undefined4 local_3054;
  undefined4 local_3050;
  undefined8 local_3048;
  undefined1 (*local_3040) [32];
  int local_3034;
  int local_3030;
  int local_302c;
  int local_3028;
  int local_3024;
  int local_3020;
  int local_301c;
  long *local_3010;
  undefined1 local_2ffd;
  int local_2ffc;
  undefined8 *local_2ff0;
  undefined8 *local_2fe8;
  undefined8 *local_2fd8;
  undefined4 local_2fc4;
  undefined1 local_2fc0 [32];
  undefined1 local_2fa0 [32];
  undefined1 (*local_2f68) [32];
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  int local_2f20 [2];
  int aiStack_2f18 [2];
  int aiStack_2f10 [2];
  int aiStack_2f08 [2];
  undefined8 local_2f00;
  undefined8 uStack_2ef8;
  undefined8 uStack_2ef0;
  undefined8 uStack_2ee8;
  undefined1 local_2ee0 [8];
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  float local_2ec0;
  float fStack_2ebc;
  float fStack_2eb8;
  float fStack_2eb4;
  float fStack_2eb0;
  float fStack_2eac;
  float fStack_2ea8;
  float fStack_2ea4;
  undefined1 local_2ea0 [32];
  undefined1 local_2e80 [32];
  undefined1 local_2e60 [8];
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined1 local_2e40 [32];
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined1 local_2de0 [8];
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined1 local_2dc0 [32];
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined8 local_2c20;
  undefined8 uStack_2c18;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined1 local_2b60 [32];
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined1 local_2b00 [8];
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined1 local_2ac0 [32];
  undefined1 local_2aa0 [32];
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 local_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined1 local_29c0 [32];
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  ulong uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined1 (*local_28c8) [32];
  undefined4 local_28c0;
  undefined4 uStack_28bc;
  undefined4 uStack_28b8;
  undefined4 uStack_28b4;
  undefined4 local_28a4;
  undefined1 local_28a0 [16];
  undefined1 (*local_2888) [32];
  undefined8 local_2880;
  ulong uStack_2878;
  undefined8 local_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 local_2850;
  undefined8 uStack_2848;
  int local_2840 [2];
  int aiStack_2838 [2];
  undefined8 local_2830;
  undefined8 uStack_2828;
  undefined1 local_2820 [8];
  undefined8 uStack_2818;
  float local_2810;
  float fStack_280c;
  float fStack_2808;
  float fStack_2804;
  undefined1 local_2800 [16];
  undefined1 local_27f0 [16];
  undefined1 local_27e0 [8];
  undefined8 uStack_27d8;
  undefined1 local_27d0 [16];
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined1 local_27b0 [16];
  undefined1 local_27a0 [8];
  undefined8 uStack_2798;
  undefined8 local_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 local_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 local_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 local_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 local_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 local_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 local_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined8 local_26a0;
  undefined8 uStack_2698;
  undefined8 local_2690;
  undefined8 uStack_2688;
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [16];
  undefined8 local_2650;
  undefined8 uStack_2648;
  undefined1 local_2640 [16];
  undefined1 local_2630 [8];
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined1 local_2610 [16];
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 local_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 local_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined8 local_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 local_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined1 local_2550 [16];
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 local_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 local_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  ulong uStack_24f8;
  undefined8 local_24f0;
  undefined8 uStack_24e8;
  undefined1 (*local_24d8) [32];
  long local_24d0;
  undefined4 local_24c4;
  long local_24c0;
  undefined1 (*local_24b8) [32];
  undefined4 local_24ac;
  int local_24a8;
  int local_24a4;
  undefined8 *local_24a0;
  undefined4 local_2494;
  long local_2490;
  undefined8 *local_2470;
  undefined1 local_2440 [16];
  undefined1 auStack_2430 [16];
  undefined4 local_2420;
  undefined4 local_241c;
  undefined4 local_2418;
  undefined4 local_2414;
  undefined4 local_2410;
  undefined4 local_240c;
  undefined4 local_2408;
  undefined4 local_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 uStack_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 uStack_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined1 local_2310 [16];
  undefined1 local_2300 [16];
  undefined4 local_22e4;
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  undefined8 local_22a0;
  undefined8 uStack_2298;
  undefined8 uStack_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined8 local_2200;
  undefined8 uStack_21f8;
  undefined8 uStack_21f0;
  undefined8 uStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 local_2190;
  undefined8 uStack_2188;
  undefined1 local_2180 [16];
  undefined1 local_2170 [16];
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 local_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  undefined8 uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 local_1fe0;
  undefined8 uStack_1fd8;
  undefined8 uStack_1fd0;
  undefined8 uStack_1fc8;
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40;
  float fStack_1f3c;
  float fStack_1f38;
  float fStack_1f34;
  float fStack_1f30;
  float fStack_1f2c;
  float fStack_1f28;
  float fStack_1f24;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 local_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  float local_1e60;
  float fStack_1e5c;
  float fStack_1e58;
  float fStack_1e54;
  float fStack_1e50;
  float fStack_1e4c;
  float fStack_1e48;
  float fStack_1e44;
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  float local_1d80;
  float fStack_1d7c;
  float fStack_1d78;
  float fStack_1d74;
  float fStack_1d70;
  float fStack_1d6c;
  float fStack_1d68;
  float fStack_1d64;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  float local_1ca0;
  float fStack_1c9c;
  float fStack_1c98;
  float fStack_1c94;
  float fStack_1c90;
  float fStack_1c8c;
  float fStack_1c88;
  float fStack_1c84;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0;
  float fStack_1bbc;
  float fStack_1bb8;
  float fStack_1bb4;
  float fStack_1bb0;
  float fStack_1bac;
  float fStack_1ba8;
  float fStack_1ba4;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  undefined4 uStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  float local_1920;
  float fStack_191c;
  float fStack_1918;
  float fStack_1914;
  float fStack_1910;
  float fStack_190c;
  float fStack_1908;
  float fStack_1904;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  float local_18e0;
  float fStack_18dc;
  float fStack_18d8;
  float fStack_18d4;
  float fStack_18d0;
  float fStack_18cc;
  float fStack_18c8;
  float fStack_18c4;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [32];
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  undefined4 uStack_1824;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  float local_1760;
  float fStack_175c;
  float fStack_1758;
  float fStack_1754;
  float fStack_1750;
  float fStack_174c;
  float fStack_1748;
  float fStack_1744;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 local_1720;
  undefined8 uStack_1718;
  undefined8 uStack_1710;
  undefined8 uStack_1708;
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  float local_1680;
  float fStack_167c;
  float fStack_1678;
  float fStack_1674;
  float fStack_1670;
  float fStack_166c;
  float fStack_1668;
  float fStack_1664;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  float local_1300;
  float fStack_12fc;
  float fStack_12f8;
  float fStack_12f4;
  float fStack_12f0;
  float fStack_12ec;
  float fStack_12e8;
  float fStack_12e4;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140;
  float fStack_113c;
  float fStack_1138;
  float fStack_1134;
  float fStack_1130;
  float fStack_112c;
  float fStack_1128;
  float fStack_1124;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080;
  float fStack_107c;
  float fStack_1078;
  float fStack_1074;
  float fStack_1070;
  float fStack_106c;
  float fStack_1068;
  float fStack_1064;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  float local_fa0;
  float fStack_f9c;
  float fStack_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  float fStack_f88;
  float fStack_f84;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined4 local_e34;
  undefined8 local_e30;
  undefined8 uStack_e28;
  undefined4 local_e14;
  undefined8 local_e10;
  undefined8 uStack_e08;
  undefined4 local_df4;
  undefined8 local_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 local_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 local_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined1 local_bb0 [16];
  undefined1 local_ba0 [16];
  undefined4 local_b84;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 local_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 local_af0;
  undefined8 uStack_ae8;
  undefined4 local_ad4;
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined4 local_ab4;
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined4 local_a94;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 local_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 local_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 local_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 local_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 local_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  float local_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 local_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 local_830;
  undefined8 uStack_828;
  float local_820;
  float fStack_81c;
  float fStack_818;
  float fStack_814;
  undefined8 local_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 local_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  float local_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  float local_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  float local_660;
  float fStack_65c;
  float fStack_658;
  float fStack_654;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  float local_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [16];
  undefined8 local_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  float local_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  float local_4a0;
  float fStack_49c;
  float fStack_498;
  float fStack_494;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  float local_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 local_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  float local_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200;
  float fStack_1fc;
  float fStack_1f8;
  float fStack_1f4;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar78 [24];
  undefined1 auVar79 [32];
  
  local_301c = *(int *)((long)in_RSI + 0x2c);
  local_3020 = (int)in_RSI[6];
  local_3024 = *(int *)((long)in_RSI + 0x34);
  local_3028 = (int)in_RSI[7];
  local_302c = (int)in_RSI[3];
  local_3030 = local_301c * local_3020 * local_3024 * local_302c;
  local_3010 = in_RSI;
  for (local_3034 = 0; local_3034 < local_3028; local_3034 = local_3034 + 1) {
    local_2ff0 = &local_3088;
    local_24a4 = *(int *)((long)local_3010 + 0x2c);
    local_24a8 = (int)local_3010[6];
    local_24ac = *(undefined4 *)((long)local_3010 + 0x34);
    local_24b8 = (undefined1 (*) [32])
                 (*local_3010 + local_3010[8] * (long)local_3034 * local_3010[2]);
    local_24c0 = local_3010[2];
    local_24c4 = (undefined4)local_3010[3];
    local_24d0 = local_3010[4];
    local_24a0 = &local_3088;
    local_2490 = (long)local_24a4 * (long)local_24a8 * local_24c0;
    local_2fe8 = &local_3088;
    local_2fd8 = &local_3088;
    local_2494 = 0x10;
    local_2ffc = local_3034;
    local_2ffd = 1;
    local_3088 = 0;
    local_3078 = 0;
    local_3070 = 0;
    local_3060 = 0;
    local_305c = 0;
    local_3058 = 0;
    local_3054 = 0;
    local_3050 = 0;
    local_3048 = 0;
    local_3080 = 0;
    local_3098 = 0;
    local_2fc4 = 0x3f800000;
    local_2404 = 0x3f800000;
    local_2408 = 0x3f800000;
    local_240c = 0x3f800000;
    local_2410 = 0x3f800000;
    local_2414 = 0x3f800000;
    local_2418 = 0x3f800000;
    local_241c = 0x3f800000;
    local_2420 = 0x3f800000;
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    local_2440 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    auVar4 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x20);
    auStack_2430 = vinsertps_avx(auVar4,ZEXT416(0x3f800000),0x30);
    local_2fa0._8_8_ = SUB328(ZEXT832(0),4);
    local_3040 = local_24b8;
    for (; local_3098 + 7 < local_3030; local_3098 = local_3098 + 8) {
      local_2f68 = local_3040;
      local_2f40 = *(undefined8 *)*local_3040;
      uStack_2f38 = *(undefined8 *)(*local_3040 + 8);
      uStack_2f30 = *(undefined8 *)(*local_3040 + 0x10);
      uStack_2f28 = *(undefined8 *)(*local_3040 + 0x18);
      uStack_30f4 = (undefined4)((ulong)uStack_2f38 >> 0x20);
      uStack_30f0 = (undefined4)uStack_2f30;
      uStack_30ec = (undefined4)((ulong)uStack_2f30 >> 0x20);
      uStack_30e8 = (undefined4)uStack_2f28;
      uStack_30e4 = (undefined4)((ulong)uStack_2f28 >> 0x20);
      auVar1._12_4_ = uStack_30f4;
      auVar1._0_12_ = *(undefined1 (*) [12])*local_3040;
      auVar1._16_4_ = uStack_30f0;
      auVar1._20_4_ = uStack_30ec;
      auVar1._24_4_ = uStack_30e8;
      auVar1._28_4_ = uStack_30e4;
      local_2fc0 = ZEXT1632(ZEXT816(0) << 0x40);
      auVar2 = vcmpps_avx(local_2fc0,auVar1,1);
      local_2f20[0] = 0x7fffffff;
      local_2f20[1] = 0x7fffffff;
      aiStack_2f18[0] = 0x7fffffff;
      aiStack_2f18[1] = 0x7fffffff;
      aiStack_2f10[0] = 0x7fffffff;
      aiStack_2f10[1] = 0x7fffffff;
      aiStack_2f08[0] = 0x7fffffff;
      aiStack_2f08[1] = 0x7fffffff;
      auVar6._8_4_ = 0x7fffffff;
      auVar6._12_4_ = 0x7fffffff;
      auVar6._0_4_ = 0x7fffffff;
      auVar6._4_4_ = 0x7fffffff;
      auVar6._16_4_ = 0x7fffffff;
      auVar6._20_4_ = 0x7fffffff;
      auVar6._24_4_ = 0x7fffffff;
      auVar6._28_4_ = 0x7fffffff;
      auVar1 = vandps_avx(*local_3040,auVar6);
      local_2920 = 0;
      uStack_2918 = local_2fa0._8_8_;
      uStack_2910 = 0;
      uStack_2908 = 0;
      local_3140 = auVar1._0_8_;
      local_2940 = local_3140;
      uStack_3138 = auVar1._8_8_;
      uStack_2938 = uStack_3138;
      uStack_3130 = auVar1._16_8_;
      uStack_2930 = uStack_3130;
      uStack_3128 = auVar1._24_8_;
      uStack_2928 = uStack_3128;
      auVar1 = vsubps_avx(ZEXT832((ulong)local_2fa0._8_8_) << 0x40,auVar1);
      local_2e20 = 0x3f8000003f800000;
      uStack_2e18 = 0x3f8000003f800000;
      uStack_2e10 = 0x3f8000003f800000;
      uStack_2e08 = 0x3f8000003f800000;
      local_2ac0._0_8_ = auVar1._0_8_;
      local_d60 = local_2ac0._0_8_;
      local_2ac0._8_8_ = auVar1._8_8_;
      uStack_d58 = local_2ac0._8_8_;
      local_2ac0._16_8_ = auVar1._16_8_;
      uStack_d50 = local_2ac0._16_8_;
      local_2ac0._24_8_ = auVar1._24_8_;
      uStack_d48 = local_2ac0._24_8_;
      local_d80 = 0x42b0c0a542b0c0a5;
      uStack_d78 = 0x42b0c0a542b0c0a5;
      uStack_d70 = 0x42b0c0a542b0c0a5;
      uStack_d68 = 0x42b0c0a542b0c0a5;
      auVar47._8_8_ = 0x42b0c0a542b0c0a5;
      auVar47._0_8_ = 0x42b0c0a542b0c0a5;
      auVar47._16_8_ = 0x42b0c0a542b0c0a5;
      auVar47._24_8_ = 0x42b0c0a542b0c0a5;
      auVar1 = vminps_avx(auVar1,auVar47);
      local_2ac0._0_8_ = auVar1._0_8_;
      local_23e0 = local_2ac0._0_8_;
      local_2ac0._8_8_ = auVar1._8_8_;
      uStack_23d8 = local_2ac0._8_8_;
      local_2ac0._16_8_ = auVar1._16_8_;
      uStack_23d0 = local_2ac0._16_8_;
      local_2ac0._24_8_ = auVar1._24_8_;
      uStack_23c8 = local_2ac0._24_8_;
      local_2400 = 0xc2b0c0a5c2b0c0a5;
      uStack_23f8 = 0xc2b0c0a5c2b0c0a5;
      uStack_23f0 = 0xc2b0c0a5c2b0c0a5;
      uStack_23e8 = 0xc2b0c0a5c2b0c0a5;
      auVar36._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar36._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar6 = vmaxps_avx(auVar1,auVar36);
      local_2ac0._0_8_ = auVar6._0_8_;
      local_1a40 = local_2ac0._0_8_;
      local_2ac0._8_8_ = auVar6._8_8_;
      uStack_1a38 = local_2ac0._8_8_;
      local_2ac0._16_8_ = auVar6._16_8_;
      uStack_1a30 = local_2ac0._16_8_;
      local_2ac0._24_8_ = auVar6._24_8_;
      uStack_1a28 = local_2ac0._24_8_;
      local_1a60 = 0x3fb8aa3b3fb8aa3b;
      uStack_1a58 = 0x3fb8aa3b3fb8aa3b;
      uStack_1a50 = 0x3fb8aa3b3fb8aa3b;
      uStack_1a48 = 0x3fb8aa3b3fb8aa3b;
      local_2260 = 0x3f0000003f000000;
      uStack_2258 = 0x3f0000003f000000;
      uStack_2250 = 0x3f0000003f000000;
      uStack_2248 = 0x3f0000003f000000;
      uVar9 = local_2ac0._0_8_;
      uVar10 = local_2ac0._8_8_;
      uVar11 = local_2ac0._16_8_;
      uVar12 = local_2ac0._24_8_;
      local_19e0 = 0x3fb8aa3b3fb8aa3b;
      uStack_19d8 = 0x3fb8aa3b3fb8aa3b;
      uStack_19d0 = 0x3fb8aa3b3fb8aa3b;
      uStack_19c8 = 0x3fb8aa3b3fb8aa3b;
      local_19c0._0_4_ = auVar6._0_4_;
      local_19c0._4_4_ = auVar6._4_4_;
      uStack_19b8._0_4_ = auVar6._8_4_;
      uStack_19b8._4_4_ = auVar6._12_4_;
      uStack_19b0._0_4_ = auVar6._16_4_;
      uStack_19b0._4_4_ = auVar6._20_4_;
      uStack_19a8._0_4_ = auVar6._24_4_;
      uStack_19e4 = 0x3fb8aa3b;
      local_1a00 = (float)local_19c0 * 1.442695;
      fStack_19fc = local_19c0._4_4_ * 1.442695;
      fStack_19f8 = (float)uStack_19b8 * 1.442695;
      fStack_19f4 = uStack_19b8._4_4_ * 1.442695;
      fStack_19f0 = (float)uStack_19b0 * 1.442695;
      fStack_19ec = uStack_19b0._4_4_ * 1.442695;
      fStack_19e8 = (float)uStack_19a8 * 1.442695;
      local_1a20 = 0x3f0000003f000000;
      uStack_1a18 = 0x3f0000003f000000;
      uStack_1a10 = 0x3f0000003f000000;
      uStack_1a08 = 0x3f0000003f000000;
      local_2b00._4_4_ = fStack_19fc + 0.5;
      local_2b00._0_4_ = local_1a00 + 0.5;
      uStack_2af8._0_4_ = fStack_19f8 + 0.5;
      uStack_2af8._4_4_ = fStack_19f4 + 0.5;
      uStack_2af0._0_4_ = fStack_19f0 + 0.5;
      uStack_2af0._4_4_ = fStack_19ec + 0.5;
      uStack_2ae8._0_4_ = fStack_19e8 + 0.5;
      uStack_2ae8._4_4_ = 0x3ff8aa3b;
      auVar8 = vroundps_avx(_local_2b00,1);
      auVar1 = vcmpps_avx(_local_2b00,auVar8,1);
      local_2b60._0_8_ = auVar1._0_8_;
      local_2a60 = local_2b60._0_8_;
      local_2b60._8_8_ = auVar1._8_8_;
      uStack_2a58 = local_2b60._8_8_;
      local_2b60._16_8_ = auVar1._16_8_;
      uStack_2a50 = local_2b60._16_8_;
      local_2b60._24_8_ = auVar1._24_8_;
      uStack_2a48 = local_2b60._24_8_;
      local_2a80 = 0x3f8000003f800000;
      uStack_2a78 = 0x3f8000003f800000;
      uStack_2a70 = 0x3f8000003f800000;
      uStack_2a68 = 0x3f8000003f800000;
      auVar26._8_8_ = 0x3f8000003f800000;
      auVar26._0_8_ = 0x3f8000003f800000;
      auVar26._16_8_ = 0x3f8000003f800000;
      auVar26._24_8_ = 0x3f8000003f800000;
      local_2b60 = vandps_avx(auVar1,auVar26);
      local_2ae0 = auVar8._0_8_;
      local_29e0 = local_2ae0;
      uStack_2ad8 = auVar8._8_8_;
      uStack_29d8 = uStack_2ad8;
      uStack_2ad0 = auVar8._16_8_;
      uStack_29d0 = uStack_2ad0;
      uStack_2ac8 = auVar8._24_8_;
      uStack_29c8 = uStack_2ac8;
      local_2a00 = local_2b60._0_8_;
      uStack_29f8 = local_2b60._8_8_;
      uStack_29f0 = local_2b60._16_8_;
      uStack_29e8 = local_2b60._24_8_;
      _local_2b00 = vsubps_avx(auVar8,local_2b60);
      local_fc0 = local_2b00;
      uStack_fb8 = uStack_2af8;
      uStack_fb0 = uStack_2af0;
      uStack_fa8 = uStack_2ae8;
      local_1000 = local_2ac0._0_8_;
      uStack_ff8 = local_2ac0._8_8_;
      uStack_ff0 = local_2ac0._16_8_;
      uStack_fe8 = local_2ac0._24_8_;
      local_1980 = 0x3f3180003f318000;
      uStack_1978 = 0x3f3180003f318000;
      uStack_1970 = 0x3f3180003f318000;
      uStack_1968 = 0x3f3180003f318000;
      local_f80 = local_2ac0._0_8_;
      uStack_f78 = local_2ac0._8_8_;
      uStack_f70 = local_2ac0._16_8_;
      uStack_f68 = local_2ac0._24_8_;
      local_f60 = 0x3f3180003f318000;
      uStack_f58 = 0x3f3180003f318000;
      uStack_f50 = 0x3f3180003f318000;
      uStack_f48 = 0x3f3180003f318000;
      local_f40._0_4_ = local_2b00._0_4_;
      local_f40._4_4_ = local_2b00._4_4_;
      uStack_f38._0_4_ = local_2b00._8_4_;
      uStack_f38._4_4_ = local_2b00._12_4_;
      uStack_f30._0_4_ = local_2b00._16_4_;
      uStack_f30._4_4_ = local_2b00._20_4_;
      uStack_f28._0_4_ = local_2b00._24_4_;
      uStack_f28._4_4_ = local_2b00._28_4_;
      fStack_f84 = uStack_f28._4_4_;
      local_fa0 = (float)local_f40 * 0.6933594;
      fStack_f9c = local_f40._4_4_ * 0.6933594;
      fStack_f98 = (float)uStack_f38 * 0.6933594;
      fStack_f94 = uStack_f38._4_4_ * 0.6933594;
      fStack_f90 = (float)uStack_f30 * 0.6933594;
      fStack_f8c = uStack_f30._4_4_ * 0.6933594;
      fStack_f88 = (float)uStack_f28 * 0.6933594;
      auVar43._4_4_ = fStack_f9c;
      auVar43._0_4_ = local_fa0;
      auVar43._8_4_ = fStack_f98;
      auVar43._12_4_ = fStack_f94;
      auVar43._16_4_ = fStack_f90;
      auVar43._20_4_ = fStack_f8c;
      auVar43._24_4_ = fStack_f88;
      auVar43._28_4_ = uStack_f28._4_4_;
      auVar1 = vsubps_avx(auVar6,auVar43);
      local_10a0 = local_2b00;
      uStack_1098 = uStack_2af8;
      uStack_1090 = uStack_2af0;
      uStack_1088 = uStack_2ae8;
      local_2ac0._0_8_ = auVar1._0_8_;
      local_10e0 = local_2ac0._0_8_;
      local_2ac0._8_8_ = auVar1._8_8_;
      uStack_10d8 = local_2ac0._8_8_;
      local_2ac0._16_8_ = auVar1._16_8_;
      uStack_10d0 = local_2ac0._16_8_;
      local_2ac0._24_8_ = auVar1._24_8_;
      uStack_10c8 = local_2ac0._24_8_;
      local_18a0 = 0xb95e8083b95e8083;
      uStack_1898 = 0xb95e8083b95e8083;
      uStack_1890 = 0xb95e8083b95e8083;
      uStack_1888 = 0xb95e8083b95e8083;
      local_1060 = local_2ac0._0_8_;
      uStack_1058 = local_2ac0._8_8_;
      uStack_1050 = local_2ac0._16_8_;
      uStack_1048 = local_2ac0._24_8_;
      local_1020 = local_2b00;
      uStack_1018 = uStack_2af8;
      uStack_1010 = uStack_2af0;
      uStack_1008 = uStack_2ae8;
      local_1040 = 0xb95e8083b95e8083;
      uStack_1038 = 0xb95e8083b95e8083;
      uStack_1030 = 0xb95e8083b95e8083;
      uStack_1028 = 0xb95e8083b95e8083;
      fStack_1064 = uStack_f28._4_4_;
      local_1080 = (float)local_f40 * -0.00021219444;
      fStack_107c = local_f40._4_4_ * -0.00021219444;
      fStack_1078 = (float)uStack_f38 * -0.00021219444;
      fStack_1074 = uStack_f38._4_4_ * -0.00021219444;
      fStack_1070 = (float)uStack_f30 * -0.00021219444;
      fStack_106c = uStack_f30._4_4_ * -0.00021219444;
      fStack_1068 = (float)uStack_f28 * -0.00021219444;
      auVar42._4_4_ = fStack_107c;
      auVar42._0_4_ = local_1080;
      auVar42._8_4_ = fStack_1078;
      auVar42._12_4_ = fStack_1074;
      auVar42._16_4_ = fStack_1070;
      auVar42._20_4_ = fStack_106c;
      auVar42._24_4_ = fStack_1068;
      auVar42._28_4_ = uStack_f28._4_4_;
      local_2ac0 = vsubps_avx(auVar1,auVar42);
      local_20c0 = local_2ac0._0_8_;
      uStack_20b8 = local_2ac0._8_8_;
      uStack_20b0 = local_2ac0._16_8_;
      uStack_20a8 = local_2ac0._24_8_;
      local_20a0._0_4_ = local_2ac0._0_4_;
      local_20a0._4_4_ = local_2ac0._4_4_;
      uStack_2098._0_4_ = local_2ac0._8_4_;
      uStack_2098._4_4_ = local_2ac0._12_4_;
      uStack_2090._0_4_ = local_2ac0._16_4_;
      uStack_2090._4_4_ = local_2ac0._20_4_;
      uStack_2088._0_4_ = local_2ac0._24_4_;
      uStack_2088._4_4_ = local_2ac0._28_4_;
      local_2ae0 = CONCAT44(local_20a0._4_4_ * local_20a0._4_4_,
                            (float)local_20a0 * (float)local_20a0);
      uStack_2ad8._0_4_ = (float)uStack_2098 * (float)uStack_2098;
      uStack_2ad8._4_4_ = uStack_2098._4_4_ * uStack_2098._4_4_;
      uStack_2ad0._0_4_ = (float)uStack_2090 * (float)uStack_2090;
      uStack_2ad0._4_4_ = uStack_2090._4_4_ * uStack_2090._4_4_;
      auVar78 = _local_2ae0;
      uStack_2ac8._0_4_ = (float)uStack_2088 * (float)uStack_2088;
      uStack_2ac8._4_4_ = uStack_2088._4_4_;
      auVar26 = _local_2ae0;
      local_1b20 = 0x3950696739506967;
      uStack_1b18 = 0x3950696739506967;
      uStack_1b10 = 0x3950696739506967;
      uStack_1b08 = 0x3950696739506967;
      local_1b40 = local_2ac0._0_8_;
      uStack_1b38 = local_2ac0._8_8_;
      uStack_1b30 = local_2ac0._16_8_;
      uStack_1b28 = local_2ac0._24_8_;
      local_1b60 = 0x3ab743ce3ab743ce;
      uStack_1b58 = 0x3ab743ce3ab743ce;
      uStack_1b50 = 0x3ab743ce3ab743ce;
      uStack_1b48 = 0x3ab743ce3ab743ce;
      local_1aa0 = 0x3950696739506967;
      uStack_1a98 = 0x3950696739506967;
      uStack_1a90 = 0x3950696739506967;
      uStack_1a88 = 0x3950696739506967;
      local_1ac0 = local_2ac0._0_8_;
      uStack_1ab8 = local_2ac0._8_8_;
      uStack_1ab0 = local_2ac0._16_8_;
      uStack_1aa8 = local_2ac0._24_8_;
      fStack_1ac4 = uStack_2088._4_4_;
      local_1ae0 = (float)local_20a0 * 0.00019875691;
      fStack_1adc = local_20a0._4_4_ * 0.00019875691;
      fStack_1ad8 = (float)uStack_2098 * 0.00019875691;
      fStack_1ad4 = uStack_2098._4_4_ * 0.00019875691;
      fStack_1ad0 = (float)uStack_2090 * 0.00019875691;
      fStack_1acc = uStack_2090._4_4_ * 0.00019875691;
      fStack_1ac8 = (float)uStack_2088 * 0.00019875691;
      local_1b00 = 0x3ab743ce3ab743ce;
      uStack_1af8 = 0x3ab743ce3ab743ce;
      uStack_1af0 = 0x3ab743ce3ab743ce;
      uStack_1ae8 = 0x3ab743ce3ab743ce;
      local_2b80 = CONCAT44(fStack_1adc + 0.0013981999,local_1ae0 + 0.0013981999);
      uStack_2b78 = CONCAT44(fStack_1ad4 + 0.0013981999,fStack_1ad8 + 0.0013981999);
      uStack_2b70 = CONCAT44(fStack_1acc + 0.0013981999,fStack_1ad0 + 0.0013981999);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + 0.0013981999,fStack_1ac8 + 0.0013981999);
      local_1c00 = local_2b80;
      uStack_1bf8 = uStack_2b78;
      uStack_1bf0 = uStack_2b70;
      uStack_1be8 = uStack_2b68;
      local_1c20 = local_2ac0._0_8_;
      uStack_1c18 = local_2ac0._8_8_;
      uStack_1c10 = local_2ac0._16_8_;
      uStack_1c08 = local_2ac0._24_8_;
      local_1c40 = 0x3c0889083c088908;
      uStack_1c38 = 0x3c0889083c088908;
      uStack_1c30 = 0x3c0889083c088908;
      uStack_1c28 = 0x3c0889083c088908;
      local_1b80 = local_2b80;
      uStack_1b78 = uStack_2b78;
      uStack_1b70 = uStack_2b70;
      uStack_1b68 = uStack_2b68;
      local_1ba0 = local_2ac0._0_8_;
      uStack_1b98 = local_2ac0._8_8_;
      uStack_1b90 = local_2ac0._16_8_;
      uStack_1b88 = local_2ac0._24_8_;
      fStack_1ba4 = uStack_2088._4_4_;
      local_1bc0 = (local_1ae0 + 0.0013981999) * (float)local_20a0;
      fStack_1bbc = (fStack_1adc + 0.0013981999) * local_20a0._4_4_;
      fStack_1bb8 = (fStack_1ad8 + 0.0013981999) * (float)uStack_2098;
      fStack_1bb4 = (fStack_1ad4 + 0.0013981999) * uStack_2098._4_4_;
      fStack_1bb0 = (fStack_1ad0 + 0.0013981999) * (float)uStack_2090;
      fStack_1bac = (fStack_1acc + 0.0013981999) * uStack_2090._4_4_;
      fStack_1ba8 = (fStack_1ac8 + 0.0013981999) * (float)uStack_2088;
      local_1be0 = 0x3c0889083c088908;
      uStack_1bd8 = 0x3c0889083c088908;
      uStack_1bd0 = 0x3c0889083c088908;
      uStack_1bc8 = 0x3c0889083c088908;
      local_2b80 = CONCAT44(fStack_1bbc + 0.008333452,local_1bc0 + 0.008333452);
      uStack_2b78 = CONCAT44(fStack_1bb4 + 0.008333452,fStack_1bb8 + 0.008333452);
      uStack_2b70 = CONCAT44(fStack_1bac + 0.008333452,fStack_1bb0 + 0.008333452);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + 0.008333452,fStack_1ba8 + 0.008333452);
      local_1ce0 = local_2b80;
      uStack_1cd8 = uStack_2b78;
      uStack_1cd0 = uStack_2b70;
      uStack_1cc8 = uStack_2b68;
      local_1d00 = local_2ac0._0_8_;
      uStack_1cf8 = local_2ac0._8_8_;
      uStack_1cf0 = local_2ac0._16_8_;
      uStack_1ce8 = local_2ac0._24_8_;
      local_1d20 = 0x3d2aa9c13d2aa9c1;
      uStack_1d18 = 0x3d2aa9c13d2aa9c1;
      uStack_1d10 = 0x3d2aa9c13d2aa9c1;
      uStack_1d08 = 0x3d2aa9c13d2aa9c1;
      local_1c60 = local_2b80;
      uStack_1c58 = uStack_2b78;
      uStack_1c50 = uStack_2b70;
      uStack_1c48 = uStack_2b68;
      local_1c80 = local_2ac0._0_8_;
      uStack_1c78 = local_2ac0._8_8_;
      uStack_1c70 = local_2ac0._16_8_;
      uStack_1c68 = local_2ac0._24_8_;
      fStack_1c84 = uStack_2088._4_4_;
      local_1ca0 = (local_1bc0 + 0.008333452) * (float)local_20a0;
      fStack_1c9c = (fStack_1bbc + 0.008333452) * local_20a0._4_4_;
      fStack_1c98 = (fStack_1bb8 + 0.008333452) * (float)uStack_2098;
      fStack_1c94 = (fStack_1bb4 + 0.008333452) * uStack_2098._4_4_;
      fStack_1c90 = (fStack_1bb0 + 0.008333452) * (float)uStack_2090;
      fStack_1c8c = (fStack_1bac + 0.008333452) * uStack_2090._4_4_;
      fStack_1c88 = (fStack_1ba8 + 0.008333452) * (float)uStack_2088;
      local_1cc0 = 0x3d2aa9c13d2aa9c1;
      uStack_1cb8 = 0x3d2aa9c13d2aa9c1;
      uStack_1cb0 = 0x3d2aa9c13d2aa9c1;
      uStack_1ca8 = 0x3d2aa9c13d2aa9c1;
      local_2b80 = CONCAT44(fStack_1c9c + 0.041665796,local_1ca0 + 0.041665796);
      uStack_2b78 = CONCAT44(fStack_1c94 + 0.041665796,fStack_1c98 + 0.041665796);
      uStack_2b70 = CONCAT44(fStack_1c8c + 0.041665796,fStack_1c90 + 0.041665796);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + 0.041665796,fStack_1c88 + 0.041665796);
      local_1dc0 = local_2b80;
      uStack_1db8 = uStack_2b78;
      uStack_1db0 = uStack_2b70;
      uStack_1da8 = uStack_2b68;
      local_1de0 = local_2ac0._0_8_;
      uStack_1dd8 = local_2ac0._8_8_;
      uStack_1dd0 = local_2ac0._16_8_;
      uStack_1dc8 = local_2ac0._24_8_;
      local_1e00 = 0x3e2aaaaa3e2aaaaa;
      uStack_1df8 = 0x3e2aaaaa3e2aaaaa;
      uStack_1df0 = 0x3e2aaaaa3e2aaaaa;
      uStack_1de8 = 0x3e2aaaaa3e2aaaaa;
      local_1d40 = local_2b80;
      uStack_1d38 = uStack_2b78;
      uStack_1d30 = uStack_2b70;
      uStack_1d28 = uStack_2b68;
      local_1d60 = local_2ac0._0_8_;
      uStack_1d58 = local_2ac0._8_8_;
      uStack_1d50 = local_2ac0._16_8_;
      uStack_1d48 = local_2ac0._24_8_;
      fStack_1d64 = uStack_2088._4_4_;
      local_1d80 = (local_1ca0 + 0.041665796) * (float)local_20a0;
      fStack_1d7c = (fStack_1c9c + 0.041665796) * local_20a0._4_4_;
      fStack_1d78 = (fStack_1c98 + 0.041665796) * (float)uStack_2098;
      fStack_1d74 = (fStack_1c94 + 0.041665796) * uStack_2098._4_4_;
      fStack_1d70 = (fStack_1c90 + 0.041665796) * (float)uStack_2090;
      fStack_1d6c = (fStack_1c8c + 0.041665796) * uStack_2090._4_4_;
      fStack_1d68 = (fStack_1c88 + 0.041665796) * (float)uStack_2088;
      local_1da0 = 0x3e2aaaaa3e2aaaaa;
      uStack_1d98 = 0x3e2aaaaa3e2aaaaa;
      uStack_1d90 = 0x3e2aaaaa3e2aaaaa;
      uStack_1d88 = 0x3e2aaaaa3e2aaaaa;
      local_2b80 = CONCAT44(fStack_1d7c + 0.16666666,local_1d80 + 0.16666666);
      uStack_2b78 = CONCAT44(fStack_1d74 + 0.16666666,fStack_1d78 + 0.16666666);
      uStack_2b70 = CONCAT44(fStack_1d6c + 0.16666666,fStack_1d70 + 0.16666666);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + 0.16666666,fStack_1d68 + 0.16666666);
      local_1ea0 = local_2b80;
      uStack_1e98 = uStack_2b78;
      uStack_1e90 = uStack_2b70;
      uStack_1e88 = uStack_2b68;
      local_1ec0 = local_2ac0._0_8_;
      uStack_1eb8 = local_2ac0._8_8_;
      uStack_1eb0 = local_2ac0._16_8_;
      uStack_1ea8 = local_2ac0._24_8_;
      local_1e20 = local_2b80;
      uStack_1e18 = uStack_2b78;
      uStack_1e10 = uStack_2b70;
      uStack_1e08 = uStack_2b68;
      local_1e40 = local_2ac0._0_8_;
      uStack_1e38 = local_2ac0._8_8_;
      uStack_1e30 = local_2ac0._16_8_;
      uStack_1e28 = local_2ac0._24_8_;
      fStack_1e44 = uStack_2088._4_4_;
      local_1e60 = (local_1d80 + 0.16666666) * (float)local_20a0;
      fStack_1e5c = (fStack_1d7c + 0.16666666) * local_20a0._4_4_;
      fStack_1e58 = (fStack_1d78 + 0.16666666) * (float)uStack_2098;
      fStack_1e54 = (fStack_1d74 + 0.16666666) * uStack_2098._4_4_;
      fStack_1e50 = (fStack_1d70 + 0.16666666) * (float)uStack_2090;
      fStack_1e4c = (fStack_1d6c + 0.16666666) * uStack_2090._4_4_;
      fStack_1e48 = (fStack_1d68 + 0.16666666) * (float)uStack_2088;
      local_1e80 = 0x3f0000003f000000;
      uStack_1e78 = 0x3f0000003f000000;
      uStack_1e70 = 0x3f0000003f000000;
      uStack_1e68 = 0x3f0000003f000000;
      local_2b80 = CONCAT44(fStack_1e5c + 0.5,local_1e60 + 0.5);
      uStack_2b78 = CONCAT44(fStack_1e54 + 0.5,fStack_1e58 + 0.5);
      uStack_2b70 = CONCAT44(fStack_1e4c + 0.5,fStack_1e50 + 0.5);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + 0.5,fStack_1e48 + 0.5);
      local_1f80 = local_2b80;
      uStack_1f78 = uStack_2b78;
      uStack_1f70 = uStack_2b70;
      uStack_1f68 = uStack_2b68;
      local_1fa0 = local_2ae0;
      uStack_1f98 = uStack_2ad8;
      uStack_2ad0 = auVar78._16_8_;
      uStack_1f90 = uStack_2ad0;
      uStack_2ac8 = auVar26._24_8_;
      uStack_1f88 = uStack_2ac8;
      local_1fc0 = local_2ac0._0_8_;
      uStack_1fb8 = local_2ac0._8_8_;
      uStack_1fb0 = local_2ac0._16_8_;
      uStack_1fa8 = local_2ac0._24_8_;
      local_1f00 = local_2b80;
      uStack_1ef8 = uStack_2b78;
      uStack_1ef0 = uStack_2b70;
      uStack_1ee8 = uStack_2b68;
      local_1f20 = local_2ae0;
      uStack_1f18 = uStack_2ad8;
      uStack_1f10 = uStack_2ad0;
      uStack_1f08 = uStack_2ac8;
      fStack_1f24 = uStack_2088._4_4_;
      local_1f40 = (local_1e60 + 0.5) * (float)local_20a0 * (float)local_20a0;
      fStack_1f3c = (fStack_1e5c + 0.5) * local_20a0._4_4_ * local_20a0._4_4_;
      fStack_1f38 = (fStack_1e58 + 0.5) * (float)uStack_2098 * (float)uStack_2098;
      fStack_1f34 = (fStack_1e54 + 0.5) * uStack_2098._4_4_ * uStack_2098._4_4_;
      fStack_1f30 = (fStack_1e50 + 0.5) * (float)uStack_2090 * (float)uStack_2090;
      fStack_1f2c = (fStack_1e4c + 0.5) * uStack_2090._4_4_ * uStack_2090._4_4_;
      fStack_1f28 = (fStack_1e48 + 0.5) * (float)uStack_2088 * (float)uStack_2088;
      local_1f60 = local_2ac0._0_8_;
      uStack_1f58 = local_2ac0._8_8_;
      uStack_1f50 = local_2ac0._16_8_;
      uStack_1f48 = local_2ac0._24_8_;
      local_2b80 = CONCAT44(fStack_1f3c + local_20a0._4_4_,local_1f40 + (float)local_20a0);
      uStack_2b78 = CONCAT44(fStack_1f34 + uStack_2098._4_4_,fStack_1f38 + (float)uStack_2098);
      uStack_2b70 = CONCAT44(fStack_1f2c + uStack_2090._4_4_,fStack_1f30 + (float)uStack_2090);
      uStack_2b68 = CONCAT44(uStack_2088._4_4_ + uStack_2088._4_4_,fStack_1f28 + (float)uStack_2088)
      ;
      local_2a20 = local_2b80;
      uStack_2a18 = uStack_2b78;
      uStack_2a10 = uStack_2b70;
      uStack_2a08 = uStack_2b68;
      local_2a40 = 0x3f8000003f800000;
      uStack_2a38 = 0x3f8000003f800000;
      uStack_2a30 = 0x3f8000003f800000;
      uStack_2a28 = 0x3f8000003f800000;
      fVar67 = local_1f40 + (float)local_20a0 + 1.0;
      fVar69 = fStack_1f3c + local_20a0._4_4_ + 1.0;
      fVar70 = fStack_1f38 + (float)uStack_2098 + 1.0;
      fVar71 = fStack_1f34 + uStack_2098._4_4_ + 1.0;
      fVar72 = fStack_1f30 + (float)uStack_2090 + 1.0;
      fVar73 = fStack_1f2c + uStack_2090._4_4_ + 1.0;
      fVar74 = fStack_1f28 + (float)uStack_2088 + 1.0;
      fVar75 = uStack_2088._4_4_ + uStack_2088._4_4_ + 1.0;
      local_2b80 = CONCAT44(fVar69,fVar67);
      uStack_2b78 = CONCAT44(fVar71,fVar70);
      uStack_2b70 = CONCAT44(fVar73,fVar72);
      uStack_2b68 = CONCAT44(fVar75,fVar74);
      local_d40 = local_2b00;
      uStack_d38 = uStack_2af8;
      uStack_d30 = uStack_2af0;
      uStack_d28 = uStack_2ae8;
      local_2b20 = CONCAT44((int)local_f40._4_4_,(int)(float)local_f40);
      uStack_2b18 = CONCAT44((int)uStack_f38._4_4_,(int)(float)uStack_f38);
      uStack_2b10 = CONCAT44((int)uStack_f30._4_4_,(int)(float)uStack_f30);
      uStack_2b08 = CONCAT44((int)uStack_f28._4_4_,(int)(float)uStack_f28);
      local_c40 = local_2b20;
      uStack_c38 = uStack_2b18;
      uStack_c30 = uStack_2b10;
      uStack_c28 = uStack_2b08;
      local_2160 = 0x7f0000007f;
      uStack_2158 = 0x7f0000007f;
      uStack_2150 = 0x7f0000007f;
      uStack_2148 = 0x7f0000007f;
      local_ce0 = local_2b20;
      uStack_cd8 = uStack_2b18;
      uStack_cd0 = uStack_2b10;
      uStack_cc8 = uStack_2b08;
      local_d00 = 0x7f0000007f;
      uStack_cf8 = 0x7f0000007f;
      uStack_cf0 = 0x7f0000007f;
      uStack_ce8 = 0x7f0000007f;
      local_c90 = 0x7f0000007f;
      uStack_c88 = 0x7f0000007f;
      local_ca0 = 0x7f0000007f;
      uStack_c98 = 0x7f0000007f;
      local_b10 = local_2b20;
      uStack_b08 = uStack_2b18;
      local_b20 = 0x7f0000007f;
      uStack_b18 = 0x7f0000007f;
      auVar49._8_8_ = uStack_2b18;
      auVar49._0_8_ = local_2b20;
      auVar48._8_8_ = 0x7f0000007f;
      auVar48._0_8_ = 0x7f0000007f;
      local_c70 = vpaddd_avx(auVar48,auVar49);
      local_b30 = uStack_2b10;
      uStack_b28 = uStack_2b08;
      local_b40 = 0x7f0000007f;
      uStack_b38 = 0x7f0000007f;
      auVar5._8_8_ = uStack_2b08;
      auVar5._0_8_ = uStack_2b10;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      local_c80 = vpaddd_avx(auVar3,auVar5);
      local_d20 = local_c70._0_8_;
      uStack_d18 = local_c70._8_8_;
      uStack_d10 = local_c80._0_8_;
      uStack_d08 = local_c80._8_8_;
      local_cc0 = local_c70._0_8_;
      uStack_cb8 = local_c70._8_8_;
      uStack_cb0 = local_c80._0_8_;
      uStack_ca8 = local_c80._8_8_;
      local_b80 = local_c70._0_8_;
      uStack_b78 = local_c70._8_8_;
      uStack_b70 = local_c80._0_8_;
      uStack_b68 = local_c80._8_8_;
      local_b84 = 0x17;
      local_c00 = local_c70._0_8_;
      uStack_bf8 = local_c70._8_8_;
      uStack_bf0 = local_c80._0_8_;
      uStack_be8 = local_c80._8_8_;
      local_ab0 = local_c70._0_8_;
      uStack_aa8 = local_c70._8_8_;
      local_ab4 = 0x17;
      local_ba0 = vpslld_avx(local_c70,ZEXT416(0x17));
      local_ad0 = local_c80._0_8_;
      uStack_ac8 = local_c80._8_8_;
      local_ad4 = 0x17;
      local_bb0 = vpslld_avx(local_c80,ZEXT416(0x17));
      local_c20 = local_ba0._0_8_;
      uStack_c18 = local_ba0._8_8_;
      uStack_c10 = local_bb0._0_8_;
      uStack_c08 = local_bb0._8_8_;
      local_be0 = local_ba0._0_8_;
      uStack_bd8 = local_ba0._8_8_;
      uStack_bd0 = local_bb0._0_8_;
      uStack_bc8 = local_bb0._8_8_;
      local_2b20 = local_ba0._0_8_;
      uStack_2b18 = local_ba0._8_8_;
      uStack_2b10 = local_bb0._0_8_;
      uStack_2b08 = local_bb0._8_8_;
      local_b60 = local_ba0._0_8_;
      uStack_b58 = local_ba0._8_8_;
      uStack_b50 = local_bb0._0_8_;
      uStack_b48 = local_bb0._8_8_;
      local_2ba0 = local_ba0._0_8_;
      uStack_2b98 = local_ba0._8_8_;
      uStack_2b90 = local_bb0._0_8_;
      uStack_2b88 = local_bb0._8_8_;
      local_20e0 = local_2b80;
      uStack_20d8 = uStack_2b78;
      uStack_20d0 = uStack_2b70;
      uStack_20c8 = uStack_2b68;
      local_2100 = local_ba0._0_8_;
      uStack_20f8 = local_ba0._8_8_;
      uStack_20f0 = local_bb0._0_8_;
      uStack_20e8 = local_bb0._8_8_;
      fVar67 = local_ba0._0_4_ * fVar67;
      fVar69 = local_ba0._4_4_ * fVar69;
      fVar70 = local_ba0._8_4_ * fVar70;
      fVar71 = local_ba0._12_4_ * fVar71;
      fVar72 = local_bb0._0_4_ * fVar72;
      fVar73 = local_bb0._4_4_ * fVar73;
      fVar74 = local_bb0._8_4_ * fVar74;
      local_2b80 = CONCAT44(fVar69,fVar67);
      uStack_2b78 = CONCAT44(fVar71,fVar70);
      uStack_2b70 = CONCAT44(fVar73,fVar72);
      uStack_2b68 = CONCAT44(fVar75,fVar74);
      local_2be0 = local_2b80;
      uStack_2bd8 = uStack_2b78;
      uStack_2bd0 = uStack_2b70;
      uStack_2bc8 = uStack_2b68;
      local_2bc0._0_4_ = local_2440._0_4_;
      local_2bc0._4_4_ = local_2440._4_4_;
      uStack_2bb8._0_4_ = local_2440._8_4_;
      uStack_2bb8._4_4_ = local_2440._12_4_;
      uStack_2bb0._0_4_ = auStack_2430._0_4_;
      uStack_2bb0._4_4_ = auStack_2430._4_4_;
      uStack_2ba8._0_4_ = auStack_2430._8_4_;
      uStack_2ba8._4_4_ = auStack_2430._12_4_;
      auVar76._0_8_ = CONCAT44(local_2bc0._4_4_ + fVar69,(float)local_2bc0 + fVar67);
      auVar76._8_4_ = (float)uStack_2bb8 + fVar70;
      auVar76._12_4_ = uStack_2bb8._4_4_ + fVar71;
      auVar78._16_4_ = (float)uStack_2bb0 + fVar72;
      auVar78._0_16_ = auVar76;
      auVar78._20_4_ = uStack_2bb0._4_4_ + fVar73;
      auVar79._24_4_ = (float)uStack_2ba8 + fVar74;
      auVar79._0_24_ = auVar78;
      auVar79._28_4_ = uStack_2ba8._4_4_ + fVar75;
      local_2dc0 = ZEXT1632(ZEXT816(0) << 0x40);
      local_2e40 = vcmpps_avx(auVar79,local_2dc0,2);
      uStack_2dd8 = auVar76._8_8_;
      uStack_2398 = uStack_2dd8;
      uStack_2dd0 = auVar78._16_8_;
      uStack_2390 = uStack_2dd0;
      uStack_2dc8 = auVar79._24_8_;
      uStack_2388 = uStack_2dc8;
      local_23c0 = 0x80000000800000;
      uStack_23b8 = 0x80000000800000;
      uStack_23b0 = 0x80000000800000;
      uStack_23a8 = 0x80000000800000;
      auVar38._16_8_ = uStack_2dd0;
      auVar38._0_16_ = auVar76;
      auVar38._24_8_ = uStack_2dc8;
      auVar37._8_8_ = 0x80000000800000;
      auVar37._0_8_ = 0x80000000800000;
      auVar37._16_8_ = 0x80000000800000;
      auVar37._24_8_ = 0x80000000800000;
      auVar1 = vmaxps_avx(auVar38,auVar37);
      local_2de0 = auVar1._0_8_;
      local_22c0 = local_2de0;
      uStack_2dd8 = auVar1._8_8_;
      uStack_22b8 = uStack_2dd8;
      uStack_2dd0 = auVar1._16_8_;
      uStack_22b0 = uStack_2dd0;
      uStack_2dc8 = auVar1._24_8_;
      uStack_22a8 = uStack_2dc8;
      local_22e0 = local_2de0;
      uStack_22d8 = uStack_2dd8;
      uStack_22d0 = uStack_2dd0;
      uStack_22c8 = uStack_2dc8;
      local_22e4 = 0x17;
      local_2360 = local_2de0;
      uStack_2358 = uStack_2dd8;
      uStack_2350 = uStack_2dd0;
      uStack_2348 = uStack_2dc8;
      local_e10 = local_2de0;
      uStack_e08 = uStack_2dd8;
      local_e14 = 0x17;
      local_2300 = vpsrld_avx(auVar1._0_16_,ZEXT416(0x17));
      local_e30 = uStack_2dd0;
      uStack_e28 = uStack_2dc8;
      local_e34 = 0x17;
      local_2310 = vpsrld_avx(auVar1._16_16_,ZEXT416(0x17));
      local_2380 = local_2300._0_8_;
      uStack_2378 = local_2300._8_8_;
      uStack_2370 = local_2310._0_8_;
      uStack_2368 = local_2310._8_8_;
      local_2340 = local_2300._0_8_;
      uStack_2338 = local_2300._8_8_;
      uStack_2330 = local_2310._0_8_;
      uStack_2328 = local_2310._8_8_;
      local_2d00 = local_2de0;
      uStack_2cf8 = uStack_2dd8;
      uStack_2cf0 = uStack_2dd0;
      uStack_2ce8 = uStack_2dc8;
      local_2d20 = 0x807fffff807fffff;
      uStack_2d18 = 0x807fffff807fffff;
      uStack_2d10 = 0x807fffff807fffff;
      uStack_2d08 = 0x807fffff807fffff;
      auVar25._8_8_ = 0x807fffff807fffff;
      auVar25._0_8_ = 0x807fffff807fffff;
      auVar25._16_8_ = 0x807fffff807fffff;
      auVar25._24_8_ = 0x807fffff807fffff;
      auVar1 = vandps_avx(auVar1,auVar25);
      local_2de0 = auVar1._0_8_;
      local_2240 = local_2de0;
      uStack_2dd8 = auVar1._8_8_;
      uStack_2238 = uStack_2dd8;
      uStack_2dd0 = auVar1._16_8_;
      uStack_2230 = uStack_2dd0;
      uStack_2dc8 = auVar1._24_8_;
      uStack_2228 = uStack_2dc8;
      auVar40._8_8_ = 0x3f0000003f000000;
      auVar40._0_8_ = 0x3f0000003f000000;
      auVar40._16_8_ = 0x3f0000003f000000;
      auVar40._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar1,auVar40);
      local_2140 = local_2300._0_8_;
      uStack_2138 = local_2300._8_8_;
      uStack_2130 = local_2310._0_8_;
      uStack_2128 = local_2310._8_8_;
      local_21e0 = local_2300._0_8_;
      uStack_21d8 = local_2300._8_8_;
      uStack_21d0 = local_2310._0_8_;
      uStack_21c8 = local_2310._8_8_;
      local_2200 = 0x7f0000007f;
      uStack_21f8 = 0x7f0000007f;
      uStack_21f0 = 0x7f0000007f;
      uStack_21e8 = 0x7f0000007f;
      local_2190 = 0x7f0000007f;
      uStack_2188 = 0x7f0000007f;
      local_21a0 = 0x7f0000007f;
      uStack_2198 = 0x7f0000007f;
      local_db0 = local_2300._0_8_;
      uStack_da8 = local_2300._8_8_;
      local_dc0 = 0x7f0000007f;
      uStack_db8 = 0x7f0000007f;
      auVar7._8_8_ = 0x7f0000007f;
      auVar7._0_8_ = 0x7f0000007f;
      local_2170 = vpsubd_avx(local_2300,auVar7);
      local_dd0 = local_2310._0_8_;
      uStack_dc8 = local_2310._8_8_;
      local_de0 = 0x7f0000007f;
      uStack_dd8 = 0x7f0000007f;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      local_2180 = vpsubd_avx(local_2310,auVar4);
      local_2220 = local_2170._0_8_;
      uStack_2218 = local_2170._8_8_;
      uStack_2210 = local_2180._0_8_;
      uStack_2208 = local_2180._8_8_;
      local_21c0 = local_2170._0_8_;
      uStack_21b8 = local_2170._8_8_;
      uStack_21b0 = local_2180._0_8_;
      uStack_21a8 = local_2180._8_8_;
      local_2e00 = local_2170._0_8_;
      uStack_2df8 = local_2170._8_8_;
      uStack_2df0 = local_2180._0_8_;
      uStack_2de8 = local_2180._8_8_;
      local_2120 = local_2170._0_8_;
      uStack_2118 = local_2170._8_8_;
      uStack_2110 = local_2180._0_8_;
      uStack_2108 = local_2180._8_8_;
      auVar41._16_8_ = local_2180._0_8_;
      auVar41._0_16_ = local_2170;
      auVar41._24_8_ = local_2180._8_8_;
      auVar1 = vcvtdq2ps_avx(auVar41);
      local_2e60 = auVar1._0_8_;
      uVar13 = local_2e60;
      uStack_2e58 = auVar1._8_8_;
      uVar14 = uStack_2e58;
      uStack_2e50 = auVar1._16_8_;
      uVar15 = uStack_2e50;
      uStack_2e48 = auVar1._24_8_;
      uVar16 = uStack_2e48;
      local_2c60 = 0x3f8000003f800000;
      uStack_2c58 = 0x3f8000003f800000;
      uStack_2c50 = 0x3f8000003f800000;
      uStack_2c48 = 0x3f8000003f800000;
      local_2c40._0_4_ = auVar1._0_4_;
      local_2c40._4_4_ = auVar1._4_4_;
      uStack_2c38._0_4_ = auVar1._8_4_;
      uStack_2c38._4_4_ = auVar1._12_4_;
      uStack_2c30._0_4_ = auVar1._16_4_;
      uStack_2c30._4_4_ = auVar1._20_4_;
      uStack_2c28._0_4_ = auVar1._24_4_;
      uStack_2c28._4_4_ = auVar1._28_4_;
      local_2e60._4_4_ = local_2c40._4_4_ + 1.0;
      local_2e60._0_4_ = (float)local_2c40 + 1.0;
      uStack_2e58._0_4_ = (float)uStack_2c38 + 1.0;
      uStack_2e58._4_4_ = uStack_2c38._4_4_ + 1.0;
      uStack_2e50._0_4_ = (float)uStack_2c30 + 1.0;
      uStack_2e50._4_4_ = uStack_2c30._4_4_ + 1.0;
      auVar78 = _local_2e60;
      uStack_2e48._0_4_ = (float)uStack_2c28 + 1.0;
      uStack_2e48._4_4_ = uStack_2c28._4_4_ + 1.0;
      auVar8 = _local_2e60;
      local_2e80 = vcmpps_avx(auVar6,_DAT_01f09ca0,1);
      local_2de0 = auVar6._0_8_;
      local_2d40 = local_2de0;
      uStack_2dd8 = auVar6._8_8_;
      uStack_2d38 = uStack_2dd8;
      uStack_2dd0 = auVar6._16_8_;
      uStack_2d30 = uStack_2dd0;
      uStack_2dc8 = auVar6._24_8_;
      uStack_2d28 = uStack_2dc8;
      local_2d60 = local_2e80._0_8_;
      uStack_2d58 = local_2e80._8_8_;
      uStack_2d50 = local_2e80._16_8_;
      uStack_2d48 = local_2e80._24_8_;
      local_2ea0 = vandps_avx(auVar6,local_2e80);
      local_2960 = local_2de0;
      uStack_2958 = uStack_2dd8;
      uStack_2950 = uStack_2dd0;
      uStack_2948 = uStack_2dc8;
      local_2980 = 0x3f8000003f800000;
      uStack_2978 = 0x3f8000003f800000;
      uStack_2970 = 0x3f8000003f800000;
      uStack_2968 = 0x3f8000003f800000;
      auVar28._8_8_ = 0x3f8000003f800000;
      auVar28._0_8_ = 0x3f8000003f800000;
      auVar28._16_8_ = 0x3f8000003f800000;
      auVar28._24_8_ = 0x3f8000003f800000;
      auVar1 = vsubps_avx(auVar6,auVar28);
      local_29a0 = local_2e60;
      uStack_2998 = uStack_2e58;
      uStack_2e50 = auVar78._16_8_;
      uStack_2990 = uStack_2e50;
      uStack_2e48 = auVar8._24_8_;
      uStack_2988 = uStack_2e48;
      local_2d80 = 0x3f8000003f800000;
      uStack_2d78 = 0x3f8000003f800000;
      uStack_2d70 = 0x3f8000003f800000;
      uStack_2d68 = 0x3f8000003f800000;
      local_2da0 = local_2e80._0_8_;
      uStack_2d98 = local_2e80._8_8_;
      uStack_2d90 = local_2e80._16_8_;
      uStack_2d88 = local_2e80._24_8_;
      auVar8._8_8_ = 0x3f8000003f800000;
      auVar8._0_8_ = 0x3f8000003f800000;
      auVar8._16_8_ = 0x3f8000003f800000;
      auVar8._24_8_ = 0x3f8000003f800000;
      local_29c0 = vandps_avx(auVar8,local_2e80);
      auVar27._16_8_ = uStack_2e50;
      auVar27._0_16_ = _local_2e60;
      auVar27._24_8_ = uStack_2e48;
      _local_2e60 = vsubps_avx(auVar27,local_29c0);
      local_2de0 = auVar1._0_8_;
      uVar17 = local_2de0;
      uStack_2dd8 = auVar1._8_8_;
      uVar18 = uStack_2dd8;
      uStack_2dd0 = auVar1._16_8_;
      uVar19 = uStack_2dd0;
      uStack_2dc8 = auVar1._24_8_;
      uVar20 = uStack_2dc8;
      local_2c80._0_4_ = auVar1._0_4_;
      local_2c80._4_4_ = auVar1._4_4_;
      uStack_2c78._0_4_ = auVar1._8_4_;
      uStack_2c78._4_4_ = auVar1._12_4_;
      uStack_2c70._0_4_ = auVar1._16_4_;
      uStack_2c70._4_4_ = auVar1._20_4_;
      uStack_2c68._0_4_ = auVar1._24_4_;
      uStack_2c68._4_4_ = auVar1._28_4_;
      local_2ca0._0_4_ = local_2ea0._0_4_;
      local_2ca0._4_4_ = local_2ea0._4_4_;
      uStack_2c98._0_4_ = local_2ea0._8_4_;
      uStack_2c98._4_4_ = local_2ea0._12_4_;
      uStack_2c90._0_4_ = local_2ea0._16_4_;
      uStack_2c90._4_4_ = local_2ea0._20_4_;
      uStack_2c88._0_4_ = local_2ea0._24_4_;
      uStack_2c88._4_4_ = local_2ea0._28_4_;
      local_2c80._0_4_ = (float)local_2c80 + (float)local_2ca0;
      local_2c80._4_4_ = local_2c80._4_4_ + local_2ca0._4_4_;
      uStack_2c78._0_4_ = (float)uStack_2c78 + (float)uStack_2c98;
      uStack_2c78._4_4_ = uStack_2c78._4_4_ + uStack_2c98._4_4_;
      uStack_2c70._0_4_ = (float)uStack_2c70 + (float)uStack_2c90;
      uStack_2c70._4_4_ = uStack_2c70._4_4_ + uStack_2c90._4_4_;
      uStack_2c68._0_4_ = (float)uStack_2c68 + (float)uStack_2c88;
      fStack_2ea4 = uStack_2c68._4_4_ + uStack_2c88._4_4_;
      local_2de0._4_4_ = local_2c80._4_4_;
      local_2de0._0_4_ = (float)local_2c80;
      uStack_2dd8._0_4_ = (float)uStack_2c78;
      uStack_2dd8._4_4_ = uStack_2c78._4_4_;
      uStack_2dd0._0_4_ = (float)uStack_2c70;
      uStack_2dd0._4_4_ = uStack_2c70._4_4_;
      auVar78 = _local_2de0;
      uStack_2dc8._0_4_ = (float)uStack_2c68;
      uStack_2dc8._4_4_ = fStack_2ea4;
      auVar1 = _local_2de0;
      local_2000 = local_2de0;
      uStack_1ff8 = uStack_2dd8;
      uStack_2dd0 = auVar78._16_8_;
      uStack_1ff0 = uStack_2dd0;
      uStack_2dc8 = auVar1._24_8_;
      uStack_1fe8 = uStack_2dc8;
      local_2ec0 = (float)local_2c80 * (float)local_2c80;
      fStack_2ebc = local_2c80._4_4_ * local_2c80._4_4_;
      fStack_2eb8 = (float)uStack_2c78 * (float)uStack_2c78;
      fStack_2eb4 = uStack_2c78._4_4_ * uStack_2c78._4_4_;
      fStack_2eb0 = (float)uStack_2c70 * (float)uStack_2c70;
      fStack_2eac = uStack_2c70._4_4_ * uStack_2c70._4_4_;
      fStack_2ea8 = (float)uStack_2c68 * (float)uStack_2c68;
      local_1180 = 0x3d9021bb3d9021bb;
      uStack_1178 = 0x3d9021bb3d9021bb;
      uStack_1170 = 0x3d9021bb3d9021bb;
      uStack_1168 = 0x3d9021bb3d9021bb;
      local_11a0 = local_2de0;
      uStack_1198 = uStack_2dd8;
      uStack_1190 = uStack_2dd0;
      uStack_1188 = uStack_2dc8;
      local_11c0 = 0xbdebd1b8bdebd1b8;
      uStack_11b8 = 0xbdebd1b8bdebd1b8;
      uStack_11b0 = 0xbdebd1b8bdebd1b8;
      uStack_11a8 = 0xbdebd1b8bdebd1b8;
      local_1100 = 0x3d9021bb3d9021bb;
      uStack_10f8 = 0x3d9021bb3d9021bb;
      uStack_10f0 = 0x3d9021bb3d9021bb;
      uStack_10e8 = 0x3d9021bb3d9021bb;
      local_1120 = local_2de0;
      uStack_1118 = uStack_2dd8;
      uStack_1110 = uStack_2dd0;
      uStack_1108 = uStack_2dc8;
      local_1140 = (float)local_2c80 * 0.070376836;
      fStack_113c = local_2c80._4_4_ * 0.070376836;
      fStack_1138 = (float)uStack_2c78 * 0.070376836;
      fStack_1134 = uStack_2c78._4_4_ * 0.070376836;
      fStack_1130 = (float)uStack_2c70 * 0.070376836;
      fStack_112c = uStack_2c70._4_4_ * 0.070376836;
      fStack_1128 = (float)uStack_2c68 * 0.070376836;
      local_1160 = 0xbdebd1b8bdebd1b8;
      uStack_1158 = 0xbdebd1b8bdebd1b8;
      uStack_1150 = 0xbdebd1b8bdebd1b8;
      uStack_1148 = 0xbdebd1b8bdebd1b8;
      local_2ee0._4_4_ = fStack_113c + -0.1151461;
      local_2ee0._0_4_ = local_1140 + -0.1151461;
      uStack_2ed8._0_4_ = fStack_1138 + -0.1151461;
      uStack_2ed8._4_4_ = fStack_1134 + -0.1151461;
      uStack_2ed0._0_4_ = fStack_1130 + -0.1151461;
      uStack_2ed0._4_4_ = fStack_112c + -0.1151461;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1128 + -0.1151461;
      uStack_2ec8._4_4_ = fStack_2ea4 + -0.1151461;
      auVar1 = _local_2ee0;
      local_1260 = local_2ee0;
      uStack_1258 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_1250 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_1248 = uStack_2ec8;
      local_1280 = local_2de0;
      uStack_1278 = uStack_2dd8;
      uStack_1270 = uStack_2dd0;
      uStack_1268 = uStack_2dc8;
      local_12a0 = 0x3def251a3def251a;
      uStack_1298 = 0x3def251a3def251a;
      uStack_1290 = 0x3def251a3def251a;
      uStack_1288 = 0x3def251a3def251a;
      local_11e0 = local_2ee0;
      uStack_11d8 = uStack_2ed8;
      uStack_11d0 = uStack_2ed0;
      uStack_11c8 = uStack_2ec8;
      local_1200 = local_2de0;
      uStack_11f8 = uStack_2dd8;
      uStack_11f0 = uStack_2dd0;
      uStack_11e8 = uStack_2dc8;
      local_1220 = (local_1140 + -0.1151461) * (float)local_2c80;
      fStack_121c = (fStack_113c + -0.1151461) * local_2c80._4_4_;
      fStack_1218 = (fStack_1138 + -0.1151461) * (float)uStack_2c78;
      fStack_1214 = (fStack_1134 + -0.1151461) * uStack_2c78._4_4_;
      fStack_1210 = (fStack_1130 + -0.1151461) * (float)uStack_2c70;
      fStack_120c = (fStack_112c + -0.1151461) * uStack_2c70._4_4_;
      fStack_1208 = (fStack_1128 + -0.1151461) * (float)uStack_2c68;
      local_1240 = 0x3def251a3def251a;
      uStack_1238 = 0x3def251a3def251a;
      uStack_1230 = 0x3def251a3def251a;
      uStack_1228 = 0x3def251a3def251a;
      local_2ee0._4_4_ = fStack_121c + 0.116769984;
      local_2ee0._0_4_ = local_1220 + 0.116769984;
      uStack_2ed8._0_4_ = fStack_1218 + 0.116769984;
      uStack_2ed8._4_4_ = fStack_1214 + 0.116769984;
      uStack_2ed0._0_4_ = fStack_1210 + 0.116769984;
      uStack_2ed0._4_4_ = fStack_120c + 0.116769984;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1208 + 0.116769984;
      uStack_2ec8._4_4_ = fStack_2ea4 + 0.116769984;
      auVar1 = _local_2ee0;
      local_1340 = local_2ee0;
      uStack_1338 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_1330 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_1328 = uStack_2ec8;
      local_1360 = local_2de0;
      uStack_1358 = uStack_2dd8;
      uStack_1350 = uStack_2dd0;
      uStack_1348 = uStack_2dc8;
      local_1380 = 0xbdfe5d4fbdfe5d4f;
      uStack_1378 = 0xbdfe5d4fbdfe5d4f;
      uStack_1370 = 0xbdfe5d4fbdfe5d4f;
      uStack_1368 = 0xbdfe5d4fbdfe5d4f;
      local_12c0 = local_2ee0;
      uStack_12b8 = uStack_2ed8;
      uStack_12b0 = uStack_2ed0;
      uStack_12a8 = uStack_2ec8;
      local_12e0 = local_2de0;
      uStack_12d8 = uStack_2dd8;
      uStack_12d0 = uStack_2dd0;
      uStack_12c8 = uStack_2dc8;
      local_1300 = (local_1220 + 0.116769984) * (float)local_2c80;
      fStack_12fc = (fStack_121c + 0.116769984) * local_2c80._4_4_;
      fStack_12f8 = (fStack_1218 + 0.116769984) * (float)uStack_2c78;
      fStack_12f4 = (fStack_1214 + 0.116769984) * uStack_2c78._4_4_;
      fStack_12f0 = (fStack_1210 + 0.116769984) * (float)uStack_2c70;
      fStack_12ec = (fStack_120c + 0.116769984) * uStack_2c70._4_4_;
      fStack_12e8 = (fStack_1208 + 0.116769984) * (float)uStack_2c68;
      local_1320 = 0xbdfe5d4fbdfe5d4f;
      uStack_1318 = 0xbdfe5d4fbdfe5d4f;
      uStack_1310 = 0xbdfe5d4fbdfe5d4f;
      uStack_1308 = 0xbdfe5d4fbdfe5d4f;
      local_2ee0._4_4_ = fStack_12fc + -0.12420141;
      local_2ee0._0_4_ = local_1300 + -0.12420141;
      uStack_2ed8._0_4_ = fStack_12f8 + -0.12420141;
      uStack_2ed8._4_4_ = fStack_12f4 + -0.12420141;
      uStack_2ed0._0_4_ = fStack_12f0 + -0.12420141;
      uStack_2ed0._4_4_ = fStack_12ec + -0.12420141;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_12e8 + -0.12420141;
      uStack_2ec8._4_4_ = fStack_2ea4 + -0.12420141;
      auVar1 = _local_2ee0;
      local_1420 = local_2ee0;
      uStack_1418 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_1410 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_1408 = uStack_2ec8;
      local_1440 = local_2de0;
      uStack_1438 = uStack_2dd8;
      uStack_1430 = uStack_2dd0;
      uStack_1428 = uStack_2dc8;
      local_1460 = 0x3e11e9bf3e11e9bf;
      uStack_1458 = 0x3e11e9bf3e11e9bf;
      uStack_1450 = 0x3e11e9bf3e11e9bf;
      uStack_1448 = 0x3e11e9bf3e11e9bf;
      local_13a0 = local_2ee0;
      uStack_1398 = uStack_2ed8;
      uStack_1390 = uStack_2ed0;
      uStack_1388 = uStack_2ec8;
      local_13c0 = local_2de0;
      uStack_13b8 = uStack_2dd8;
      uStack_13b0 = uStack_2dd0;
      uStack_13a8 = uStack_2dc8;
      local_13e0 = (local_1300 + -0.12420141) * (float)local_2c80;
      fStack_13dc = (fStack_12fc + -0.12420141) * local_2c80._4_4_;
      fStack_13d8 = (fStack_12f8 + -0.12420141) * (float)uStack_2c78;
      fStack_13d4 = (fStack_12f4 + -0.12420141) * uStack_2c78._4_4_;
      fStack_13d0 = (fStack_12f0 + -0.12420141) * (float)uStack_2c70;
      fStack_13cc = (fStack_12ec + -0.12420141) * uStack_2c70._4_4_;
      fStack_13c8 = (fStack_12e8 + -0.12420141) * (float)uStack_2c68;
      local_1400 = 0x3e11e9bf3e11e9bf;
      uStack_13f8 = 0x3e11e9bf3e11e9bf;
      uStack_13f0 = 0x3e11e9bf3e11e9bf;
      uStack_13e8 = 0x3e11e9bf3e11e9bf;
      local_2ee0._4_4_ = fStack_13dc + 0.14249323;
      local_2ee0._0_4_ = local_13e0 + 0.14249323;
      uStack_2ed8._0_4_ = fStack_13d8 + 0.14249323;
      uStack_2ed8._4_4_ = fStack_13d4 + 0.14249323;
      uStack_2ed0._0_4_ = fStack_13d0 + 0.14249323;
      uStack_2ed0._4_4_ = fStack_13cc + 0.14249323;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_13c8 + 0.14249323;
      uStack_2ec8._4_4_ = fStack_2ea4 + 0.14249323;
      auVar1 = _local_2ee0;
      local_1500 = local_2ee0;
      uStack_14f8 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_14f0 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_14e8 = uStack_2ec8;
      local_1520 = local_2de0;
      uStack_1518 = uStack_2dd8;
      uStack_1510 = uStack_2dd0;
      uStack_1508 = uStack_2dc8;
      local_1540 = 0xbe2aae50be2aae50;
      uStack_1538 = 0xbe2aae50be2aae50;
      uStack_1530 = 0xbe2aae50be2aae50;
      uStack_1528 = 0xbe2aae50be2aae50;
      local_1480 = local_2ee0;
      uStack_1478 = uStack_2ed8;
      uStack_1470 = uStack_2ed0;
      uStack_1468 = uStack_2ec8;
      local_14a0 = local_2de0;
      uStack_1498 = uStack_2dd8;
      uStack_1490 = uStack_2dd0;
      uStack_1488 = uStack_2dc8;
      local_14c0 = (local_13e0 + 0.14249323) * (float)local_2c80;
      fStack_14bc = (fStack_13dc + 0.14249323) * local_2c80._4_4_;
      fStack_14b8 = (fStack_13d8 + 0.14249323) * (float)uStack_2c78;
      fStack_14b4 = (fStack_13d4 + 0.14249323) * uStack_2c78._4_4_;
      fStack_14b0 = (fStack_13d0 + 0.14249323) * (float)uStack_2c70;
      fStack_14ac = (fStack_13cc + 0.14249323) * uStack_2c70._4_4_;
      fStack_14a8 = (fStack_13c8 + 0.14249323) * (float)uStack_2c68;
      local_14e0 = 0xbe2aae50be2aae50;
      uStack_14d8 = 0xbe2aae50be2aae50;
      uStack_14d0 = 0xbe2aae50be2aae50;
      uStack_14c8 = 0xbe2aae50be2aae50;
      local_2ee0._4_4_ = fStack_14bc + -0.16668057;
      local_2ee0._0_4_ = local_14c0 + -0.16668057;
      uStack_2ed8._0_4_ = fStack_14b8 + -0.16668057;
      uStack_2ed8._4_4_ = fStack_14b4 + -0.16668057;
      uStack_2ed0._0_4_ = fStack_14b0 + -0.16668057;
      uStack_2ed0._4_4_ = fStack_14ac + -0.16668057;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_14a8 + -0.16668057;
      uStack_2ec8._4_4_ = fStack_2ea4 + -0.16668057;
      auVar1 = _local_2ee0;
      local_15e0 = local_2ee0;
      uStack_15d8 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_15d0 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_15c8 = uStack_2ec8;
      local_1600 = local_2de0;
      uStack_15f8 = uStack_2dd8;
      uStack_15f0 = uStack_2dd0;
      uStack_15e8 = uStack_2dc8;
      local_1620 = 0x3e4cceac3e4cceac;
      uStack_1618 = 0x3e4cceac3e4cceac;
      uStack_1610 = 0x3e4cceac3e4cceac;
      uStack_1608 = 0x3e4cceac3e4cceac;
      local_1560 = local_2ee0;
      uStack_1558 = uStack_2ed8;
      uStack_1550 = uStack_2ed0;
      uStack_1548 = uStack_2ec8;
      local_1580 = local_2de0;
      uStack_1578 = uStack_2dd8;
      uStack_1570 = uStack_2dd0;
      uStack_1568 = uStack_2dc8;
      local_15a0 = (local_14c0 + -0.16668057) * (float)local_2c80;
      fStack_159c = (fStack_14bc + -0.16668057) * local_2c80._4_4_;
      fStack_1598 = (fStack_14b8 + -0.16668057) * (float)uStack_2c78;
      fStack_1594 = (fStack_14b4 + -0.16668057) * uStack_2c78._4_4_;
      fStack_1590 = (fStack_14b0 + -0.16668057) * (float)uStack_2c70;
      fStack_158c = (fStack_14ac + -0.16668057) * uStack_2c70._4_4_;
      fStack_1588 = (fStack_14a8 + -0.16668057) * (float)uStack_2c68;
      local_15c0 = 0x3e4cceac3e4cceac;
      uStack_15b8 = 0x3e4cceac3e4cceac;
      uStack_15b0 = 0x3e4cceac3e4cceac;
      uStack_15a8 = 0x3e4cceac3e4cceac;
      local_2ee0._4_4_ = fStack_159c + 0.20000714;
      local_2ee0._0_4_ = local_15a0 + 0.20000714;
      uStack_2ed8._0_4_ = fStack_1598 + 0.20000714;
      uStack_2ed8._4_4_ = fStack_1594 + 0.20000714;
      uStack_2ed0._0_4_ = fStack_1590 + 0.20000714;
      uStack_2ed0._4_4_ = fStack_158c + 0.20000714;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1588 + 0.20000714;
      uStack_2ec8._4_4_ = fStack_2ea4 + 0.20000714;
      auVar1 = _local_2ee0;
      local_16c0 = local_2ee0;
      uStack_16b8 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_16b0 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_16a8 = uStack_2ec8;
      local_16e0 = local_2de0;
      uStack_16d8 = uStack_2dd8;
      uStack_16d0 = uStack_2dd0;
      uStack_16c8 = uStack_2dc8;
      local_1700 = 0xbe7ffffcbe7ffffc;
      uStack_16f8 = 0xbe7ffffcbe7ffffc;
      uStack_16f0 = 0xbe7ffffcbe7ffffc;
      uStack_16e8 = 0xbe7ffffcbe7ffffc;
      local_1640 = local_2ee0;
      uStack_1638 = uStack_2ed8;
      uStack_1630 = uStack_2ed0;
      uStack_1628 = uStack_2ec8;
      local_1660 = local_2de0;
      uStack_1658 = uStack_2dd8;
      uStack_1650 = uStack_2dd0;
      uStack_1648 = uStack_2dc8;
      local_1680 = (local_15a0 + 0.20000714) * (float)local_2c80;
      fStack_167c = (fStack_159c + 0.20000714) * local_2c80._4_4_;
      fStack_1678 = (fStack_1598 + 0.20000714) * (float)uStack_2c78;
      fStack_1674 = (fStack_1594 + 0.20000714) * uStack_2c78._4_4_;
      fStack_1670 = (fStack_1590 + 0.20000714) * (float)uStack_2c70;
      fStack_166c = (fStack_158c + 0.20000714) * uStack_2c70._4_4_;
      fStack_1668 = (fStack_1588 + 0.20000714) * (float)uStack_2c68;
      local_16a0 = 0xbe7ffffcbe7ffffc;
      uStack_1698 = 0xbe7ffffcbe7ffffc;
      uStack_1690 = 0xbe7ffffcbe7ffffc;
      uStack_1688 = 0xbe7ffffcbe7ffffc;
      local_2ee0._4_4_ = fStack_167c + -0.24999994;
      local_2ee0._0_4_ = local_1680 + -0.24999994;
      uStack_2ed8._0_4_ = fStack_1678 + -0.24999994;
      uStack_2ed8._4_4_ = fStack_1674 + -0.24999994;
      uStack_2ed0._0_4_ = fStack_1670 + -0.24999994;
      uStack_2ed0._4_4_ = fStack_166c + -0.24999994;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1668 + -0.24999994;
      uStack_2ec8._4_4_ = fStack_2ea4 + -0.24999994;
      auVar1 = _local_2ee0;
      local_17a0 = local_2ee0;
      uStack_1798 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_1790 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_1788 = uStack_2ec8;
      local_17c0 = local_2de0;
      uStack_17b8 = uStack_2dd8;
      uStack_17b0 = uStack_2dd0;
      uStack_17a8 = uStack_2dc8;
      local_17e0 = 0x3eaaaaaa3eaaaaaa;
      uStack_17d8 = 0x3eaaaaaa3eaaaaaa;
      uStack_17d0 = 0x3eaaaaaa3eaaaaaa;
      uStack_17c8 = 0x3eaaaaaa3eaaaaaa;
      local_1720 = local_2ee0;
      uStack_1718 = uStack_2ed8;
      uStack_1710 = uStack_2ed0;
      uStack_1708 = uStack_2ec8;
      local_1740 = local_2de0;
      uStack_1738 = uStack_2dd8;
      uStack_1730 = uStack_2dd0;
      uStack_1728 = uStack_2dc8;
      local_1760 = (local_1680 + -0.24999994) * (float)local_2c80;
      fStack_175c = (fStack_167c + -0.24999994) * local_2c80._4_4_;
      fStack_1758 = (fStack_1678 + -0.24999994) * (float)uStack_2c78;
      fStack_1754 = (fStack_1674 + -0.24999994) * uStack_2c78._4_4_;
      fStack_1750 = (fStack_1670 + -0.24999994) * (float)uStack_2c70;
      fStack_174c = (fStack_166c + -0.24999994) * uStack_2c70._4_4_;
      fStack_1748 = (fStack_1668 + -0.24999994) * (float)uStack_2c68;
      local_1780 = 0x3eaaaaaa3eaaaaaa;
      uStack_1778 = 0x3eaaaaaa3eaaaaaa;
      uStack_1770 = 0x3eaaaaaa3eaaaaaa;
      uStack_1768 = 0x3eaaaaaa3eaaaaaa;
      fVar73 = fStack_2ea4 + 0.3333333;
      local_2ee0._4_4_ = fStack_175c + 0.3333333;
      local_2ee0._0_4_ = local_1760 + 0.3333333;
      uStack_2ed8._0_4_ = fStack_1758 + 0.3333333;
      uStack_2ed8._4_4_ = fStack_1754 + 0.3333333;
      uStack_2ed0._0_4_ = fStack_1750 + 0.3333333;
      uStack_2ed0._4_4_ = fStack_174c + 0.3333333;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1748 + 0.3333333;
      uStack_2ec8._4_4_ = fVar73;
      auVar1 = _local_2ee0;
      local_2020 = local_2ee0;
      uStack_2018 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_2010 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_2008 = uStack_2ec8;
      local_2040 = local_2de0;
      uStack_2038 = uStack_2dd8;
      uStack_2030 = uStack_2dd0;
      uStack_2028 = uStack_2dc8;
      local_2ee0._0_4_ = (local_1760 + 0.3333333) * (float)local_2c80;
      local_2ee0._4_4_ = (fStack_175c + 0.3333333) * local_2c80._4_4_;
      fVar67 = (fStack_1758 + 0.3333333) * (float)uStack_2c78;
      fVar69 = (fStack_1754 + 0.3333333) * uStack_2c78._4_4_;
      fVar70 = (fStack_1750 + 0.3333333) * (float)uStack_2c70;
      fVar71 = (fStack_174c + 0.3333333) * uStack_2c70._4_4_;
      fVar72 = (fStack_1748 + 0.3333333) * (float)uStack_2c68;
      uStack_2ed8._0_4_ = fVar67;
      uStack_2ed8._4_4_ = fVar69;
      uStack_2ed0._0_4_ = fVar70;
      uStack_2ed0._4_4_ = fVar71;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fVar72;
      auVar1 = _local_2ee0;
      local_2060 = local_2ee0;
      uStack_2058 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_2050 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_2048 = uStack_2ec8;
      local_2080 = CONCAT44(fStack_2ebc,local_2ec0);
      uStack_2078 = CONCAT44(fStack_2eb4,fStack_2eb8);
      uStack_2070 = CONCAT44(fStack_2eac,fStack_2eb0);
      uStack_2068 = CONCAT44(fStack_2ea4,fStack_2ea8);
      local_2ee0._0_4_ = (float)local_2ee0._0_4_ * local_2ec0;
      local_2ee0._4_4_ = (float)local_2ee0._4_4_ * fStack_2ebc;
      fVar67 = fVar67 * fStack_2eb8;
      fVar69 = fVar69 * fStack_2eb4;
      fVar70 = fVar70 * fStack_2eb0;
      fVar71 = fVar71 * fStack_2eac;
      fVar72 = fVar72 * fStack_2ea8;
      uStack_2ed8._0_4_ = fVar67;
      uStack_2ed8._4_4_ = fVar69;
      uStack_2ed0._0_4_ = fVar70;
      uStack_2ed0._4_4_ = fVar71;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fVar72;
      auVar1 = _local_2ee0;
      local_18c0 = local_2ee0;
      uStack_18b8 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_18b0 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_18a8 = uStack_2ec8;
      local_1880._0_8_ = local_2e60;
      local_1880._8_8_ = local_2e60._8_8_;
      local_1880._16_8_ = local_2e60._16_8_;
      local_1880._24_8_ = local_2e60._24_8_;
      local_1820 = 0xb95e8083b95e8083;
      uStack_1818 = 0xb95e8083b95e8083;
      uStack_1810 = 0xb95e8083b95e8083;
      uStack_1808 = 0xb95e8083b95e8083;
      local_1800._0_4_ = local_2e60._0_4_;
      local_1800._4_4_ = local_2e60._4_4_;
      uStack_17f8._0_4_ = local_2e60._8_4_;
      uStack_17f8._4_4_ = local_2e60._12_4_;
      uStack_17f0._0_4_ = local_2e60._16_4_;
      uStack_17f0._4_4_ = local_2e60._20_4_;
      uStack_17e8._0_4_ = local_2e60._24_4_;
      uStack_1824 = 0xb95e8083;
      local_1840 = (float)local_1800 * -0.00021219444;
      fStack_183c = local_1800._4_4_ * -0.00021219444;
      fStack_1838 = (float)uStack_17f8 * -0.00021219444;
      fStack_1834 = uStack_17f8._4_4_ * -0.00021219444;
      fStack_1830 = (float)uStack_17f0 * -0.00021219444;
      fStack_182c = uStack_17f0._4_4_ * -0.00021219444;
      fStack_1828 = (float)uStack_17e8 * -0.00021219444;
      local_1860 = local_2ee0;
      uStack_1858 = uStack_2ed8;
      uStack_1850 = uStack_2ed0;
      uStack_1848 = uStack_2ec8;
      local_2ee0._4_4_ = fStack_183c + (float)local_2ee0._4_4_;
      local_2ee0._0_4_ = local_1840 + (float)local_2ee0._0_4_;
      uStack_2ed8._0_4_ = fStack_1838 + fVar67;
      uStack_2ed8._4_4_ = fStack_1834 + fVar69;
      uStack_2ed0._0_4_ = fStack_1830 + fVar70;
      uStack_2ed0._4_4_ = fStack_182c + fVar71;
      auVar78 = _local_2ee0;
      uStack_2ec8._0_4_ = fStack_1828 + fVar72;
      uStack_2ec8._4_4_ = fVar73 + -0.00021219444;
      auVar1 = _local_2ee0;
      local_ee0 = CONCAT44(fStack_2ebc,local_2ec0);
      uStack_ed8 = CONCAT44(fStack_2eb4,fStack_2eb8);
      uStack_ed0 = CONCAT44(fStack_2eac,fStack_2eb0);
      uStack_ec8 = CONCAT44(fStack_2ea4,fStack_2ea8);
      local_f20 = local_2ee0;
      uStack_f18 = uStack_2ed8;
      uStack_2ed0 = auVar78._16_8_;
      uStack_f10 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uStack_f08 = uStack_2ec8;
      local_ea0 = local_2ee0;
      uStack_e98 = uStack_2ed8;
      uStack_e90 = uStack_2ed0;
      uStack_e88 = uStack_2ec8;
      local_e80 = 0x3f0000003f000000;
      uStack_e78 = 0x3f0000003f000000;
      uStack_e70 = 0x3f0000003f000000;
      uStack_e68 = 0x3f0000003f000000;
      local_ec0 = local_2ec0 * 0.5;
      fStack_ebc = fStack_2ebc * 0.5;
      fStack_eb8 = fStack_2eb8 * 0.5;
      fStack_eb4 = fStack_2eb4 * 0.5;
      fStack_eb0 = fStack_2eb0 * 0.5;
      fStack_eac = fStack_2eac * 0.5;
      fStack_ea8 = fStack_2ea8 * 0.5;
      auVar45._16_8_ = uStack_2ed0;
      auVar45._0_16_ = _local_2ee0;
      auVar45._24_8_ = uStack_2ec8;
      auVar44._4_4_ = fStack_ebc;
      auVar44._0_4_ = local_ec0;
      auVar44._8_4_ = fStack_eb8;
      auVar44._12_4_ = fStack_eb4;
      auVar44._16_4_ = fStack_eb0;
      auVar44._20_4_ = fStack_eac;
      auVar44._24_4_ = fStack_ea8;
      auVar44._28_4_ = fStack_2ea4;
      auVar1 = vsubps_avx(auVar45,auVar44);
      local_2cc0 = local_2de0;
      uStack_2cb8 = uStack_2dd8;
      uStack_2cb0 = uStack_2dd0;
      uStack_2ca8 = uStack_2dc8;
      local_2ee0 = auVar1._0_8_;
      uVar21 = local_2ee0;
      uStack_2ed8 = auVar1._8_8_;
      uVar22 = uStack_2ed8;
      uStack_2ed0 = auVar1._16_8_;
      uVar23 = uStack_2ed0;
      uStack_2ec8 = auVar1._24_8_;
      uVar24 = uStack_2ec8;
      local_2ce0._0_4_ = auVar1._0_4_;
      local_2ce0._4_4_ = auVar1._4_4_;
      uStack_2cd8._0_4_ = auVar1._8_4_;
      uStack_2cd8._4_4_ = auVar1._12_4_;
      uStack_2cd0._0_4_ = auVar1._16_4_;
      uStack_2cd0._4_4_ = auVar1._20_4_;
      uStack_2cc8._0_4_ = auVar1._24_4_;
      uStack_2cc8._4_4_ = auVar1._28_4_;
      local_2de0._4_4_ = local_2c80._4_4_ + local_2ce0._4_4_;
      local_2de0._0_4_ = (float)local_2c80 + (float)local_2ce0;
      uStack_2dd8._0_4_ = (float)uStack_2c78 + (float)uStack_2cd8;
      uStack_2dd8._4_4_ = uStack_2c78._4_4_ + uStack_2cd8._4_4_;
      uStack_2dd0._0_4_ = (float)uStack_2c70 + (float)uStack_2cd0;
      uStack_2dd0._4_4_ = uStack_2c70._4_4_ + uStack_2cd0._4_4_;
      auVar78 = _local_2de0;
      uStack_2dc8._0_4_ = (float)uStack_2c68 + (float)uStack_2cc8;
      uStack_2dc8._4_4_ = fStack_2ea4 + uStack_2cc8._4_4_;
      auVar1 = _local_2de0;
      local_1960 = local_1880._0_8_;
      uStack_1958 = local_1880._8_8_;
      uStack_1950 = local_1880._16_8_;
      local_19a0 = local_2de0;
      uStack_1998 = uStack_2dd8;
      uStack_2dd0 = auVar78._16_8_;
      uStack_1990 = uStack_2dd0;
      uStack_2dc8 = auVar1._24_8_;
      uStack_1988 = uStack_2dc8;
      local_18e0 = (float)local_1800;
      fStack_18dc = local_1800._4_4_;
      fStack_18d8 = (float)uStack_17f8;
      fStack_18d4 = uStack_17f8._4_4_;
      fStack_18d0 = (float)uStack_17f0;
      fStack_18cc = uStack_17f0._4_4_;
      fStack_18c8 = (float)uStack_17e8;
      uStack_1948._4_4_ = local_2e60._28_4_;
      fStack_1904 = uStack_1948._4_4_;
      local_1900 = 0x3f3180003f318000;
      uStack_18f8 = 0x3f3180003f318000;
      uStack_18f0 = 0x3f3180003f318000;
      uStack_18e8 = 0x3f3180003f318000;
      local_1920 = (float)local_1800 * 0.6933594;
      fStack_191c = local_1800._4_4_ * 0.6933594;
      fStack_1918 = (float)uStack_17f8 * 0.6933594;
      fStack_1914 = uStack_17f8._4_4_ * 0.6933594;
      fStack_1910 = (float)uStack_17f0 * 0.6933594;
      fStack_190c = uStack_17f0._4_4_ * 0.6933594;
      fStack_1908 = (float)uStack_17e8 * 0.6933594;
      local_1940 = local_2de0;
      uStack_1938 = uStack_2dd8;
      uStack_1930 = uStack_2dd0;
      uStack_1928 = uStack_2dc8;
      local_2de0._4_4_ = fStack_191c + local_2c80._4_4_ + local_2ce0._4_4_;
      local_2de0._0_4_ = local_1920 + (float)local_2c80 + (float)local_2ce0;
      uStack_2dd8._0_4_ = fStack_1918 + (float)uStack_2c78 + (float)uStack_2cd8;
      uStack_2dd8._4_4_ = fStack_1914 + uStack_2c78._4_4_ + uStack_2cd8._4_4_;
      uStack_2dd0._0_4_ = fStack_1910 + (float)uStack_2c70 + (float)uStack_2cd0;
      uStack_2dd0._4_4_ = fStack_190c + uStack_2c70._4_4_ + uStack_2cd0._4_4_;
      auVar78 = _local_2de0;
      uStack_2dc8._0_4_ = fStack_1908 + (float)uStack_2c68 + (float)uStack_2cc8;
      uStack_2dc8._4_4_ = uStack_1948._4_4_ + fStack_2ea4 + uStack_2cc8._4_4_;
      auVar6 = _local_2de0;
      local_2280 = local_2de0;
      uStack_2278 = uStack_2dd8;
      uStack_2dd0 = auVar78._16_8_;
      uStack_2270 = uStack_2dd0;
      uStack_2dc8 = auVar6._24_8_;
      uStack_2268 = uStack_2dc8;
      local_22a0 = local_2e40._0_8_;
      uStack_2298 = local_2e40._8_8_;
      uStack_2290 = local_2e40._16_8_;
      uStack_2288 = local_2e40._24_8_;
      auVar39._16_8_ = uStack_2dd0;
      auVar39._0_16_ = _local_2de0;
      auVar39._24_8_ = uStack_2dc8;
      _local_2ee0 = vorps_avx(auVar39,local_2e40);
      local_3120 = auVar2._0_8_;
      local_2f60 = local_3120;
      uStack_3118 = auVar2._8_8_;
      uStack_2f58 = uStack_3118;
      uStack_3110 = auVar2._16_8_;
      uStack_2f50 = uStack_3110;
      uStack_3108 = auVar2._24_8_;
      uStack_2f48 = uStack_3108;
      auVar1 = vandps_avx(*local_3040,auVar2);
      local_3180 = auVar1._0_8_;
      uStack_3178 = auVar1._8_8_;
      uStack_3170 = auVar1._16_8_;
      uStack_3168 = auVar1._24_8_;
      local_2c00._0_4_ = auVar1._0_4_;
      local_2c00._4_4_ = auVar1._4_4_;
      uStack_2bf8._0_4_ = auVar1._8_4_;
      uStack_2bf8._4_4_ = auVar1._12_4_;
      uStack_2bf0._0_4_ = auVar1._16_4_;
      uStack_2bf0._4_4_ = auVar1._20_4_;
      uStack_2be8._0_4_ = auVar1._24_4_;
      uStack_2be8._4_4_ = auVar1._28_4_;
      local_2c20._0_4_ = local_2ee0._0_4_;
      local_2c20._4_4_ = local_2ee0._4_4_;
      uStack_2c18._0_4_ = local_2ee0._8_4_;
      uStack_2c18._4_4_ = local_2ee0._12_4_;
      uStack_2c10._0_4_ = local_2ee0._16_4_;
      uStack_2c10._4_4_ = local_2ee0._20_4_;
      uStack_2c08._0_4_ = local_2ee0._24_4_;
      uStack_2c08._4_4_ = local_2ee0._28_4_;
      local_28c8 = local_3040;
      local_2900 = CONCAT44(local_2c00._4_4_ + local_2c20._4_4_,
                            (float)local_2c00 + (float)local_2c20);
      uStack_28f8 = CONCAT44(uStack_2bf8._4_4_ + uStack_2c18._4_4_,
                             (float)uStack_2bf8 + (float)uStack_2c18);
      uStack_28f0 = CONCAT44(uStack_2bf0._4_4_ + uStack_2c10._4_4_,
                             (float)uStack_2bf0 + (float)uStack_2c10);
      uStack_28e8 = CONCAT44(uStack_2be8._4_4_ + uStack_2c08._4_4_,
                             (float)uStack_2be8 + (float)uStack_2c08);
      *(undefined8 *)*local_3040 = local_2900;
      *(undefined8 *)(*local_3040 + 8) = uStack_28f8;
      *(undefined8 *)(*local_3040 + 0x10) = uStack_28f0;
      *(undefined8 *)(*local_3040 + 0x18) = uStack_28e8;
      local_3040 = local_3040 + 1;
      local_2f00 = local_2f40;
      uStack_2ef8 = uStack_2f38;
      uStack_2ef0 = uStack_2f30;
      uStack_2ee8 = uStack_2f28;
      _local_2de0 = auVar6;
      local_2ce0 = uVar21;
      uStack_2cd8 = uVar22;
      uStack_2cd0 = uVar23;
      uStack_2cc8 = uVar24;
      local_2ca0 = local_2ea0._0_8_;
      uStack_2c98 = local_2ea0._8_8_;
      uStack_2c90 = local_2ea0._16_8_;
      uStack_2c88 = local_2ea0._24_8_;
      local_2c80 = uVar17;
      uStack_2c78 = uVar18;
      uStack_2c70 = uVar19;
      uStack_2c68 = uVar20;
      local_2c40 = uVar13;
      uStack_2c38 = uVar14;
      uStack_2c30 = uVar15;
      uStack_2c28 = uVar16;
      local_2c20 = local_2ee0;
      uStack_2c18 = uStack_2ed8;
      uStack_2c10 = uStack_2ed0;
      uStack_2c08 = uStack_2ec8;
      local_2c00 = local_3180;
      uStack_2bf8 = uStack_3178;
      uStack_2bf0 = uStack_3170;
      uStack_2be8 = uStack_3168;
      local_2bc0 = local_2440._0_8_;
      uStack_2bb8 = local_2440._8_8_;
      uStack_2bb0 = auStack_2430._0_8_;
      uStack_2ba8 = auStack_2430._8_8_;
      local_2b40 = local_2e20;
      uStack_2b38 = uStack_2e18;
      uStack_2b30 = uStack_2e10;
      uStack_2b28 = uStack_2e08;
      _local_2ae0 = auVar26;
      local_2aa0 = local_2fc0;
      local_23a0 = auVar76._0_8_;
      local_20a0 = local_20c0;
      uStack_2098 = uStack_20b8;
      uStack_2090 = uStack_20b0;
      uStack_2088 = uStack_20a8;
      local_1fe0 = local_2000;
      uStack_1fd8 = uStack_1ff8;
      uStack_1fd0 = uStack_1ff0;
      uStack_1fc8 = uStack_1fe8;
      local_1ee0 = local_2260;
      uStack_1ed8 = uStack_2258;
      uStack_1ed0 = uStack_2250;
      uStack_1ec8 = uStack_2248;
      local_1a80 = local_2260;
      uStack_1a78 = uStack_2258;
      uStack_1a70 = uStack_2250;
      uStack_1a68 = uStack_2248;
      local_19c0 = uVar9;
      uStack_19b8 = uVar10;
      uStack_19b0 = uVar11;
      uStack_19a8 = uVar12;
      uStack_1948 = local_1880._24_8_;
      fStack_18c4 = fStack_1904;
      local_1880 = _local_2e60;
      local_1800 = local_1880._0_8_;
      uStack_17f8 = local_1880._8_8_;
      uStack_17f0 = local_1880._16_8_;
      uStack_17e8 = local_1880._24_8_;
      fStack_1744 = fStack_2ea4;
      fStack_1664 = fStack_2ea4;
      fStack_1584 = fStack_2ea4;
      fStack_14a4 = fStack_2ea4;
      fStack_13c4 = fStack_2ea4;
      fStack_12e4 = fStack_2ea4;
      fStack_1204 = fStack_2ea4;
      fStack_1124 = fStack_2ea4;
      local_10c0 = local_18a0;
      uStack_10b8 = uStack_1898;
      uStack_10b0 = uStack_1890;
      uStack_10a8 = uStack_1888;
      local_fe0 = local_1980;
      uStack_fd8 = uStack_1978;
      uStack_fd0 = uStack_1970;
      uStack_fc8 = uStack_1968;
      local_f40 = local_2b00;
      uStack_f38 = uStack_2af8;
      uStack_f30 = uStack_2af0;
      uStack_f28 = uStack_2ae8;
      local_f00 = local_2260;
      uStack_ef8 = uStack_2258;
      uStack_ef0 = uStack_2250;
      uStack_ee8 = uStack_2248;
      fStack_ea4 = fStack_2ea4;
      local_e60 = local_ee0;
      uStack_e58 = uStack_ed8;
      uStack_e50 = uStack_ed0;
      uStack_e48 = uStack_ec8;
      local_c60 = local_2160;
      uStack_c58 = uStack_2158;
      uStack_c50 = uStack_2150;
      uStack_c48 = uStack_2148;
    }
    local_28a4 = 0x3f800000;
    local_28c0 = 0x3f800000;
    uStack_28bc = 0x3f800000;
    uStack_28b8 = 0x3f800000;
    uStack_28b4 = 0x3f800000;
    local_28a0._8_8_ = SUB168(ZEXT816(0),4);
    for (; local_2fa0 = ZEXT832(0) << 0x20, auVar4 = ZEXT816(0) << 0x20, local_2470 = local_2fd8,
        local_3068 = local_24d0, local_3098 + 3 < local_3030; local_3098 = local_3098 + 4) {
      local_2888 = local_3040;
      local_2870 = *(undefined8 *)*local_3040;
      uStack_2868 = *(undefined8 *)(*local_3040 + 8);
      local_2880 = 0;
      uStack_2878 = local_28a0._8_8_;
      auVar65._8_8_ = 0;
      auVar65._0_8_ = local_28a0._8_8_;
      auVar4 = vcmpps_avx(auVar65 << 0x40,*(undefined1 (*) [16])*local_3040,1);
      local_2840[0] = 0x7fffffff;
      local_2840[1] = 0x7fffffff;
      aiStack_2838[0] = 0x7fffffff;
      aiStack_2838[1] = 0x7fffffff;
      auVar29._8_4_ = 0x7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar29._0_4_ = 0x7fffffff;
      auVar29._4_4_ = 0x7fffffff;
      auVar7 = vpand_avx(*(undefined1 (*) [16])*local_3040,auVar29);
      local_2500 = 0;
      uStack_24f8 = local_28a0._8_8_;
      local_31d0 = auVar7._0_8_;
      local_2510 = local_31d0;
      uStack_31c8 = auVar7._8_8_;
      uStack_2508 = uStack_31c8;
      auVar66._8_8_ = 0;
      auVar66._0_8_ = local_28a0._8_8_;
      auVar7 = vsubps_avx(auVar66 << 0x40,auVar7);
      local_2600 = 0;
      uStack_25f8 = 0;
      local_27c0 = 0x3f8000003f800000;
      uStack_27b8 = 0x3f8000003f800000;
      local_2610._0_8_ = auVar7._0_8_;
      local_70 = local_2610._0_8_;
      local_2610._8_8_ = auVar7._8_8_;
      uStack_68 = local_2610._8_8_;
      local_80 = 0x42b0c0a542b0c0a5;
      uStack_78 = 0x42b0c0a542b0c0a5;
      auVar64._8_8_ = 0x42b0c0a542b0c0a5;
      auVar64._0_8_ = 0x42b0c0a542b0c0a5;
      auVar7 = vminps_avx(auVar7,auVar64);
      local_2610._0_8_ = auVar7._0_8_;
      local_a50 = local_2610._0_8_;
      local_2610._8_8_ = auVar7._8_8_;
      uStack_a48 = local_2610._8_8_;
      local_a60 = 0xc2b0c0a5c2b0c0a5;
      uStack_a58 = 0xc2b0c0a5c2b0c0a5;
      auVar53._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar53._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar5 = vmaxps_avx(auVar7,auVar53);
      local_2610._0_8_ = auVar5._0_8_;
      uVar9 = local_2610._0_8_;
      local_2610._8_8_ = auVar5._8_8_;
      uVar10 = local_2610._8_8_;
      local_950 = 0x3fb8aa3b3fb8aa3b;
      uStack_948 = 0x3fb8aa3b3fb8aa3b;
      local_940._0_4_ = auVar5._0_4_;
      local_940._4_4_ = auVar5._4_4_;
      uStack_938._0_4_ = auVar5._8_4_;
      uStack_938._4_4_ = auVar5._12_4_;
      local_2630._4_4_ = local_940._4_4_ * 1.442695;
      local_2630._0_4_ = (float)local_940 * 1.442695;
      uStack_2628._0_4_ = (float)uStack_938 * 1.442695;
      uStack_2628._4_4_ = uStack_938._4_4_ * 1.442695;
      local_2580 = local_2630;
      uStack_2578 = uStack_2628;
      local_2590 = 0x3f0000003f000000;
      uStack_2588 = 0x3f0000003f000000;
      local_2630._0_4_ = (float)local_940 * 1.442695 + 0.5;
      local_2630._4_4_ = local_940._4_4_ * 1.442695 + 0.5;
      fVar67 = (float)uStack_938 * 1.442695 + 0.5;
      fVar69 = uStack_938._4_4_ * 1.442695 + 0.5;
      uStack_2628._0_4_ = fVar67;
      uStack_2628._4_4_ = fVar69;
      local_50 = local_2630;
      uStack_48 = uStack_2628;
      local_2640._4_4_ = (int)(float)local_2630._4_4_;
      local_2640._0_4_ = (int)(float)local_2630._0_4_;
      local_2640._8_4_ = (int)fVar67;
      local_2640._12_4_ = (int)fVar69;
      local_9d0 = local_2640._0_8_;
      uStack_9c8 = local_2640._8_8_;
      auVar58._8_8_ = local_2640._8_8_;
      auVar58._0_8_ = local_2640._0_8_;
      auVar3 = vcvtdq2ps_avx(auVar58);
      local_2620 = auVar3._0_8_;
      local_25e0 = local_2620;
      uStack_2618 = auVar3._8_8_;
      uStack_25d8 = uStack_2618;
      local_25f0 = local_2630;
      uStack_25e8 = uStack_2628;
      auVar32._8_8_ = uStack_2628;
      auVar32._0_8_ = local_2630;
      auVar7 = vcmpps_avx(auVar32,auVar3,1);
      local_2660._0_8_ = auVar7._0_8_;
      local_25c0 = local_2660._0_8_;
      local_2660._8_8_ = auVar7._8_8_;
      uStack_25b8 = local_2660._8_8_;
      local_25d0 = 0x3f8000003f800000;
      uStack_25c8 = 0x3f8000003f800000;
      auVar33._8_8_ = 0x3f8000003f800000;
      auVar33._0_8_ = 0x3f8000003f800000;
      local_2660 = vpand_avx(auVar7,auVar33);
      local_2560 = local_2620;
      uStack_2558 = uStack_2618;
      local_2570 = local_2660._0_8_;
      uStack_2568 = local_2660._8_8_;
      _local_2630 = vsubps_avx(auVar3,local_2660);
      local_140 = local_2630;
      uStack_138 = uStack_2628;
      local_160 = local_2610._0_8_;
      uStack_158 = local_2610._8_8_;
      local_620 = 0x3f3180003f318000;
      uStack_618 = 0x3f3180003f318000;
      local_120 = local_2610._0_8_;
      uStack_118 = local_2610._8_8_;
      local_110 = 0x3f3180003f318000;
      uStack_108 = 0x3f3180003f318000;
      local_100._0_4_ = local_2630._0_4_;
      local_100._4_4_ = local_2630._4_4_;
      uStack_f8._0_4_ = local_2630._8_4_;
      uStack_f8._4_4_ = local_2630._12_4_;
      local_130 = (float)local_100 * 0.6933594;
      fStack_12c = local_100._4_4_ * 0.6933594;
      fStack_128 = (float)uStack_f8 * 0.6933594;
      fStack_124 = uStack_f8._4_4_ * 0.6933594;
      auVar61._4_4_ = fStack_12c;
      auVar61._0_4_ = local_130;
      auVar61._8_4_ = fStack_128;
      auVar61._12_4_ = fStack_124;
      auVar7 = vsubps_avx(auVar5,auVar61);
      local_1b0 = local_2630;
      uStack_1a8 = uStack_2628;
      local_2610._0_8_ = auVar7._0_8_;
      local_1d0 = local_2610._0_8_;
      local_2610._8_8_ = auVar7._8_8_;
      uStack_1c8 = local_2610._8_8_;
      local_5b0 = 0xb95e8083b95e8083;
      uStack_5a8 = 0xb95e8083b95e8083;
      local_190 = local_2610._0_8_;
      uStack_188 = local_2610._8_8_;
      local_170 = local_2630;
      uStack_168 = uStack_2628;
      local_180 = 0xb95e8083b95e8083;
      uStack_178 = 0xb95e8083b95e8083;
      local_1a0 = (float)local_100 * -0.00021219444;
      fStack_19c = local_100._4_4_ * -0.00021219444;
      fStack_198 = (float)uStack_f8 * -0.00021219444;
      fStack_194 = uStack_f8._4_4_ * -0.00021219444;
      auVar60._4_4_ = fStack_19c;
      auVar60._0_4_ = local_1a0;
      auVar60._8_4_ = fStack_198;
      auVar60._12_4_ = fStack_194;
      local_2610 = vsubps_avx(auVar7,auVar60);
      local_970 = local_2610._0_8_;
      uStack_968 = local_2610._8_8_;
      local_960._0_4_ = local_2610._0_4_;
      local_960._4_4_ = local_2610._4_4_;
      uStack_958._0_4_ = local_2610._8_4_;
      uStack_958._4_4_ = local_2610._12_4_;
      local_2620 = CONCAT44(local_960._4_4_ * local_960._4_4_,(float)local_960 * (float)local_960);
      uStack_2618._0_4_ = (float)uStack_958 * (float)uStack_958;
      uStack_2618._4_4_ = uStack_958._4_4_ * uStack_958._4_4_;
      local_680 = 0x3950696739506967;
      uStack_678 = 0x3950696739506967;
      local_690 = local_2610._0_8_;
      uStack_688 = local_2610._8_8_;
      local_6a0 = 0x3ab743ce3ab743ce;
      uStack_698 = 0x3ab743ce3ab743ce;
      local_640 = 0x3950696739506967;
      uStack_638 = 0x3950696739506967;
      local_650 = local_2610._0_8_;
      uStack_648 = local_2610._8_8_;
      local_660 = (float)local_960 * 0.00019875691;
      fStack_65c = local_960._4_4_ * 0.00019875691;
      fStack_658 = (float)uStack_958 * 0.00019875691;
      fStack_654 = uStack_958._4_4_ * 0.00019875691;
      local_670 = 0x3ab743ce3ab743ce;
      uStack_668 = 0x3ab743ce3ab743ce;
      local_2670 = CONCAT44(fStack_65c + 0.0013981999,local_660 + 0.0013981999);
      uStack_2668 = CONCAT44(fStack_654 + 0.0013981999,fStack_658 + 0.0013981999);
      local_6f0 = local_2670;
      uStack_6e8 = uStack_2668;
      local_700 = local_2610._0_8_;
      uStack_6f8 = local_2610._8_8_;
      local_710 = 0x3c0889083c088908;
      uStack_708 = 0x3c0889083c088908;
      local_6b0 = local_2670;
      uStack_6a8 = uStack_2668;
      local_6c0 = local_2610._0_8_;
      uStack_6b8 = local_2610._8_8_;
      local_6d0 = (local_660 + 0.0013981999) * (float)local_960;
      fStack_6cc = (fStack_65c + 0.0013981999) * local_960._4_4_;
      fStack_6c8 = (fStack_658 + 0.0013981999) * (float)uStack_958;
      fStack_6c4 = (fStack_654 + 0.0013981999) * uStack_958._4_4_;
      local_6e0 = 0x3c0889083c088908;
      uStack_6d8 = 0x3c0889083c088908;
      local_2670 = CONCAT44(fStack_6cc + 0.008333452,local_6d0 + 0.008333452);
      uStack_2668 = CONCAT44(fStack_6c4 + 0.008333452,fStack_6c8 + 0.008333452);
      local_760 = local_2670;
      uStack_758 = uStack_2668;
      local_770 = local_2610._0_8_;
      uStack_768 = local_2610._8_8_;
      local_780 = 0x3d2aa9c13d2aa9c1;
      uStack_778 = 0x3d2aa9c13d2aa9c1;
      local_720 = local_2670;
      uStack_718 = uStack_2668;
      local_730 = local_2610._0_8_;
      uStack_728 = local_2610._8_8_;
      local_740 = (local_6d0 + 0.008333452) * (float)local_960;
      fStack_73c = (fStack_6cc + 0.008333452) * local_960._4_4_;
      fStack_738 = (fStack_6c8 + 0.008333452) * (float)uStack_958;
      fStack_734 = (fStack_6c4 + 0.008333452) * uStack_958._4_4_;
      local_750 = 0x3d2aa9c13d2aa9c1;
      uStack_748 = 0x3d2aa9c13d2aa9c1;
      local_2670 = CONCAT44(fStack_73c + 0.041665796,local_740 + 0.041665796);
      uStack_2668 = CONCAT44(fStack_734 + 0.041665796,fStack_738 + 0.041665796);
      local_7d0 = local_2670;
      uStack_7c8 = uStack_2668;
      local_7e0 = local_2610._0_8_;
      uStack_7d8 = local_2610._8_8_;
      local_7f0 = 0x3e2aaaaa3e2aaaaa;
      uStack_7e8 = 0x3e2aaaaa3e2aaaaa;
      local_790 = local_2670;
      uStack_788 = uStack_2668;
      local_7a0 = local_2610._0_8_;
      uStack_798 = local_2610._8_8_;
      local_7b0 = (local_740 + 0.041665796) * (float)local_960;
      fStack_7ac = (fStack_73c + 0.041665796) * local_960._4_4_;
      fStack_7a8 = (fStack_738 + 0.041665796) * (float)uStack_958;
      fStack_7a4 = (fStack_734 + 0.041665796) * uStack_958._4_4_;
      local_7c0 = 0x3e2aaaaa3e2aaaaa;
      uStack_7b8 = 0x3e2aaaaa3e2aaaaa;
      local_2670 = CONCAT44(fStack_7ac + 0.16666666,local_7b0 + 0.16666666);
      uStack_2668 = CONCAT44(fStack_7a4 + 0.16666666,fStack_7a8 + 0.16666666);
      local_840 = local_2670;
      uStack_838 = uStack_2668;
      local_850 = local_2610._0_8_;
      uStack_848 = local_2610._8_8_;
      local_800 = local_2670;
      uStack_7f8 = uStack_2668;
      local_810 = local_2610._0_8_;
      uStack_808 = local_2610._8_8_;
      local_820 = (local_7b0 + 0.16666666) * (float)local_960;
      fStack_81c = (fStack_7ac + 0.16666666) * local_960._4_4_;
      fStack_818 = (fStack_7a8 + 0.16666666) * (float)uStack_958;
      fStack_814 = (fStack_7a4 + 0.16666666) * uStack_958._4_4_;
      local_830 = 0x3f0000003f000000;
      uStack_828 = 0x3f0000003f000000;
      local_2670 = CONCAT44(fStack_81c + 0.5,local_820 + 0.5);
      uStack_2668 = CONCAT44(fStack_814 + 0.5,fStack_818 + 0.5);
      local_8b0 = local_2670;
      uStack_8a8 = uStack_2668;
      local_8c0 = local_2620;
      uStack_8b8 = uStack_2618;
      local_8d0 = local_2610._0_8_;
      uStack_8c8 = local_2610._8_8_;
      local_870 = local_2670;
      uStack_868 = uStack_2668;
      local_880 = local_2620;
      uStack_878 = uStack_2618;
      local_890 = (local_820 + 0.5) * (float)local_960 * (float)local_960;
      fStack_88c = (fStack_81c + 0.5) * local_960._4_4_ * local_960._4_4_;
      fStack_888 = (fStack_818 + 0.5) * (float)uStack_958 * (float)uStack_958;
      fStack_884 = (fStack_814 + 0.5) * uStack_958._4_4_ * uStack_958._4_4_;
      local_8a0 = local_2610._0_8_;
      uStack_898 = local_2610._8_8_;
      local_2670 = CONCAT44(fStack_88c + local_960._4_4_,local_890 + (float)local_960);
      uStack_2668 = CONCAT44(fStack_884 + uStack_958._4_4_,fStack_888 + (float)uStack_958);
      local_25a0 = local_2670;
      uStack_2598 = uStack_2668;
      local_25b0 = 0x3f8000003f800000;
      uStack_25a8 = 0x3f8000003f800000;
      fVar67 = local_890 + (float)local_960 + 1.0;
      fVar69 = fStack_88c + local_960._4_4_ + 1.0;
      fVar70 = fStack_888 + (float)uStack_958 + 1.0;
      fVar71 = fStack_884 + uStack_958._4_4_ + 1.0;
      local_2670 = CONCAT44(fVar69,fVar67);
      uStack_2668 = CONCAT44(fVar71,fVar70);
      local_60 = local_2630;
      uStack_58 = uStack_2628;
      local_2640._4_4_ = (int)local_100._4_4_;
      local_2640._0_4_ = (int)(float)local_100;
      local_2640._8_4_ = (int)(float)uStack_f8;
      local_2640._12_4_ = (int)uStack_f8._4_4_;
      local_af0 = local_2640._0_8_;
      uStack_ae8 = local_2640._8_8_;
      local_da0 = 0x7f0000007f;
      uStack_d98 = 0x7f0000007f;
      auVar51._8_8_ = local_2640._8_8_;
      auVar51._0_8_ = local_2640._0_8_;
      auVar50._8_8_ = 0x7f0000007f;
      auVar50._0_8_ = 0x7f0000007f;
      auVar7 = vpaddd_avx(auVar50,auVar51);
      local_2640._0_8_ = auVar7._0_8_;
      local_a90 = local_2640._0_8_;
      local_2640._8_8_ = auVar7._8_8_;
      uStack_a88 = local_2640._8_8_;
      local_a94 = 0x17;
      local_2640 = vpslld_avx(auVar7,ZEXT416(0x17));
      local_40 = local_2640._0_8_;
      uStack_38 = local_2640._8_8_;
      local_2680 = local_2640._0_8_;
      uStack_2678 = local_2640._8_8_;
      local_980 = local_2670;
      uStack_978 = uStack_2668;
      local_990 = local_2640._0_8_;
      uStack_988 = local_2640._8_8_;
      fVar67 = local_2640._0_4_ * fVar67;
      fVar69 = local_2640._4_4_ * fVar69;
      fVar70 = local_2640._8_4_ * fVar70;
      fVar71 = local_2640._12_4_ * fVar71;
      local_2670 = CONCAT44(fVar69,fVar67);
      uStack_2668 = CONCAT44(fVar71,fVar70);
      local_26a0 = local_2670;
      uStack_2698 = uStack_2668;
      auVar77._0_8_ = CONCAT44(fVar69 + 1.0,fVar67 + 1.0);
      auVar77._8_4_ = fVar70 + 1.0;
      auVar77._12_4_ = fVar71 + 1.0;
      uStack_2798 = auVar77._8_8_;
      uStack_a68 = uStack_2798;
      local_2790 = 0;
      uStack_2788 = 0;
      local_a80 = 0;
      uStack_a78 = 0;
      auVar52._8_8_ = uStack_2798;
      auVar52._0_8_ = auVar77._0_8_;
      local_27d0 = vcmpps_avx(auVar52,ZEXT816(0),2);
      uStack_a28 = uStack_2798;
      local_a40 = 0x80000000800000;
      uStack_a38 = 0x80000000800000;
      auVar55._8_8_ = uStack_2798;
      auVar55._0_8_ = auVar77._0_8_;
      auVar54._8_8_ = 0x80000000800000;
      auVar54._0_8_ = 0x80000000800000;
      auVar7 = vmaxps_avx(auVar55,auVar54);
      local_27a0 = auVar7._0_8_;
      local_a20 = local_27a0;
      uStack_2798 = auVar7._8_8_;
      uStack_a18 = uStack_2798;
      local_df0 = local_27a0;
      uStack_de8 = uStack_2798;
      local_df4 = 0x17;
      auVar5 = vpsrld_avx(auVar7,ZEXT416(0x17));
      local_2730 = local_27a0;
      uStack_2728 = uStack_2798;
      local_2740 = 0x807fffff807fffff;
      uStack_2738 = 0x807fffff807fffff;
      auVar31._8_8_ = 0x807fffff807fffff;
      auVar31._0_8_ = 0x807fffff807fffff;
      auVar7 = vpand_avx(auVar7,auVar31);
      local_27a0 = auVar7._0_8_;
      local_9e0 = local_27a0;
      uStack_2798 = auVar7._8_8_;
      uStack_9d8 = uStack_2798;
      auVar57._8_8_ = 0x3f0000003f000000;
      auVar57._0_8_ = 0x3f0000003f000000;
      auVar3 = vpor_avx(auVar7,auVar57);
      local_27b0._0_8_ = auVar5._0_8_;
      local_d90 = local_27b0._0_8_;
      local_27b0._8_8_ = auVar5._8_8_;
      uStack_d88 = local_27b0._8_8_;
      auVar46._8_8_ = 0x7f0000007f;
      auVar46._0_8_ = 0x7f0000007f;
      local_27b0 = vpsubd_avx(auVar5,auVar46);
      local_9c0 = local_27b0._0_8_;
      uStack_9b8 = local_27b0._8_8_;
      auVar7 = vcvtdq2ps_avx(local_27b0);
      local_27e0 = auVar7._0_8_;
      uVar11 = local_27e0;
      uStack_27d8 = auVar7._8_8_;
      uVar12 = uStack_27d8;
      local_26e0 = 0x3f8000003f800000;
      uStack_26d8 = 0x3f8000003f800000;
      local_26d0._0_4_ = auVar7._0_4_;
      local_26d0._4_4_ = auVar7._4_4_;
      uStack_26c8._0_4_ = auVar7._8_4_;
      uStack_26c8._4_4_ = auVar7._12_4_;
      local_27e0._4_4_ = local_26d0._4_4_ + 1.0;
      local_27e0._0_4_ = (float)local_26d0 + 1.0;
      uStack_27d8._0_4_ = (float)uStack_26c8 + 1.0;
      uStack_27d8._4_4_ = uStack_26c8._4_4_ + 1.0;
      local_27a0 = auVar3._0_8_;
      local_9a0 = local_27a0;
      uStack_2798 = auVar3._8_8_;
      uStack_998 = uStack_2798;
      local_9b0 = 0x3f3504f33f3504f3;
      uStack_9a8 = 0x3f3504f33f3504f3;
      auVar59._8_8_ = 0x3f3504f33f3504f3;
      auVar59._0_8_ = 0x3f3504f33f3504f3;
      local_27f0 = vcmpps_avx(auVar3,auVar59,1);
      local_2750 = local_27a0;
      uStack_2748 = uStack_2798;
      local_2760 = local_27f0._0_8_;
      uStack_2758 = local_27f0._8_8_;
      local_2800 = vpand_avx(auVar3,local_27f0);
      local_2520 = local_27a0;
      uStack_2518 = uStack_2798;
      local_2530 = 0x3f8000003f800000;
      uStack_2528 = 0x3f8000003f800000;
      auVar35._8_8_ = 0x3f8000003f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar7 = vsubps_avx(auVar3,auVar35);
      local_2540 = local_27e0;
      uStack_2538 = uStack_27d8;
      local_2770 = 0x3f8000003f800000;
      uStack_2768 = 0x3f8000003f800000;
      local_2780 = local_27f0._0_8_;
      uStack_2778 = local_27f0._8_8_;
      auVar30._8_8_ = 0x3f8000003f800000;
      auVar30._0_8_ = 0x3f8000003f800000;
      local_2550 = vpand_avx(auVar30,local_27f0);
      auVar34._8_8_ = uStack_27d8;
      auVar34._0_8_ = local_27e0;
      _local_27e0 = vsubps_avx(auVar34,local_2550);
      local_27a0 = auVar7._0_8_;
      uVar13 = local_27a0;
      uStack_2798 = auVar7._8_8_;
      uVar14 = uStack_2798;
      local_26f0._0_4_ = auVar7._0_4_;
      local_26f0._4_4_ = auVar7._4_4_;
      uStack_26e8._0_4_ = auVar7._8_4_;
      uStack_26e8._4_4_ = auVar7._12_4_;
      local_2700._0_4_ = local_2800._0_4_;
      local_2700._4_4_ = local_2800._4_4_;
      uStack_26f8._0_4_ = local_2800._8_4_;
      uStack_26f8._4_4_ = local_2800._12_4_;
      local_26f0._0_4_ = (float)local_26f0 + (float)local_2700;
      local_26f0._4_4_ = local_26f0._4_4_ + local_2700._4_4_;
      uStack_26e8._0_4_ = (float)uStack_26e8 + (float)uStack_26f8;
      uStack_26e8._4_4_ = uStack_26e8._4_4_ + uStack_26f8._4_4_;
      local_27a0._4_4_ = local_26f0._4_4_;
      local_27a0._0_4_ = (float)local_26f0;
      uStack_2798._0_4_ = (float)uStack_26e8;
      uStack_2798._4_4_ = uStack_26e8._4_4_;
      local_8f0 = local_27a0;
      uStack_8e8 = uStack_2798;
      local_2810 = (float)local_26f0 * (float)local_26f0;
      fStack_280c = local_26f0._4_4_ * local_26f0._4_4_;
      fStack_2808 = (float)uStack_26e8 * (float)uStack_26e8;
      fStack_2804 = uStack_26e8._4_4_ * uStack_26e8._4_4_;
      local_220 = 0x3d9021bb3d9021bb;
      uStack_218 = 0x3d9021bb3d9021bb;
      local_230 = local_27a0;
      uStack_228 = uStack_2798;
      local_240 = 0xbdebd1b8bdebd1b8;
      uStack_238 = 0xbdebd1b8bdebd1b8;
      local_1e0 = 0x3d9021bb3d9021bb;
      uStack_1d8 = 0x3d9021bb3d9021bb;
      local_1f0 = local_27a0;
      uStack_1e8 = uStack_2798;
      local_200 = (float)local_26f0 * 0.070376836;
      fStack_1fc = local_26f0._4_4_ * 0.070376836;
      fStack_1f8 = (float)uStack_26e8 * 0.070376836;
      fStack_1f4 = uStack_26e8._4_4_ * 0.070376836;
      local_210 = 0xbdebd1b8bdebd1b8;
      uStack_208 = 0xbdebd1b8bdebd1b8;
      local_2820._4_4_ = fStack_1fc + -0.1151461;
      local_2820._0_4_ = local_200 + -0.1151461;
      uStack_2818._0_4_ = fStack_1f8 + -0.1151461;
      uStack_2818._4_4_ = fStack_1f4 + -0.1151461;
      local_290 = local_2820;
      uStack_288 = uStack_2818;
      local_2a0 = local_27a0;
      uStack_298 = uStack_2798;
      local_2b0 = 0x3def251a3def251a;
      uStack_2a8 = 0x3def251a3def251a;
      local_250 = local_2820;
      uStack_248 = uStack_2818;
      local_260 = local_27a0;
      uStack_258 = uStack_2798;
      local_270 = (local_200 + -0.1151461) * (float)local_26f0;
      fStack_26c = (fStack_1fc + -0.1151461) * local_26f0._4_4_;
      fStack_268 = (fStack_1f8 + -0.1151461) * (float)uStack_26e8;
      fStack_264 = (fStack_1f4 + -0.1151461) * uStack_26e8._4_4_;
      local_280 = 0x3def251a3def251a;
      uStack_278 = 0x3def251a3def251a;
      local_2820._4_4_ = fStack_26c + 0.116769984;
      local_2820._0_4_ = local_270 + 0.116769984;
      uStack_2818._0_4_ = fStack_268 + 0.116769984;
      uStack_2818._4_4_ = fStack_264 + 0.116769984;
      local_300 = local_2820;
      uStack_2f8 = uStack_2818;
      local_310 = local_27a0;
      uStack_308 = uStack_2798;
      local_320 = 0xbdfe5d4fbdfe5d4f;
      uStack_318 = 0xbdfe5d4fbdfe5d4f;
      local_2c0 = local_2820;
      uStack_2b8 = uStack_2818;
      local_2d0 = local_27a0;
      uStack_2c8 = uStack_2798;
      local_2e0 = (local_270 + 0.116769984) * (float)local_26f0;
      fStack_2dc = (fStack_26c + 0.116769984) * local_26f0._4_4_;
      fStack_2d8 = (fStack_268 + 0.116769984) * (float)uStack_26e8;
      fStack_2d4 = (fStack_264 + 0.116769984) * uStack_26e8._4_4_;
      local_2f0 = 0xbdfe5d4fbdfe5d4f;
      uStack_2e8 = 0xbdfe5d4fbdfe5d4f;
      local_2820._4_4_ = fStack_2dc + -0.12420141;
      local_2820._0_4_ = local_2e0 + -0.12420141;
      uStack_2818._0_4_ = fStack_2d8 + -0.12420141;
      uStack_2818._4_4_ = fStack_2d4 + -0.12420141;
      local_370 = local_2820;
      uStack_368 = uStack_2818;
      local_380 = local_27a0;
      uStack_378 = uStack_2798;
      local_390 = 0x3e11e9bf3e11e9bf;
      uStack_388 = 0x3e11e9bf3e11e9bf;
      local_330 = local_2820;
      uStack_328 = uStack_2818;
      local_340 = local_27a0;
      uStack_338 = uStack_2798;
      local_350 = (local_2e0 + -0.12420141) * (float)local_26f0;
      fStack_34c = (fStack_2dc + -0.12420141) * local_26f0._4_4_;
      fStack_348 = (fStack_2d8 + -0.12420141) * (float)uStack_26e8;
      fStack_344 = (fStack_2d4 + -0.12420141) * uStack_26e8._4_4_;
      local_360 = 0x3e11e9bf3e11e9bf;
      uStack_358 = 0x3e11e9bf3e11e9bf;
      local_2820._4_4_ = fStack_34c + 0.14249323;
      local_2820._0_4_ = local_350 + 0.14249323;
      uStack_2818._0_4_ = fStack_348 + 0.14249323;
      uStack_2818._4_4_ = fStack_344 + 0.14249323;
      local_3e0 = local_2820;
      uStack_3d8 = uStack_2818;
      local_3f0 = local_27a0;
      uStack_3e8 = uStack_2798;
      local_400 = 0xbe2aae50be2aae50;
      uStack_3f8 = 0xbe2aae50be2aae50;
      local_3a0 = local_2820;
      uStack_398 = uStack_2818;
      local_3b0 = local_27a0;
      uStack_3a8 = uStack_2798;
      local_3c0 = (local_350 + 0.14249323) * (float)local_26f0;
      fStack_3bc = (fStack_34c + 0.14249323) * local_26f0._4_4_;
      fStack_3b8 = (fStack_348 + 0.14249323) * (float)uStack_26e8;
      fStack_3b4 = (fStack_344 + 0.14249323) * uStack_26e8._4_4_;
      local_3d0 = 0xbe2aae50be2aae50;
      uStack_3c8 = 0xbe2aae50be2aae50;
      local_2820._4_4_ = fStack_3bc + -0.16668057;
      local_2820._0_4_ = local_3c0 + -0.16668057;
      uStack_2818._0_4_ = fStack_3b8 + -0.16668057;
      uStack_2818._4_4_ = fStack_3b4 + -0.16668057;
      local_450 = local_2820;
      uStack_448 = uStack_2818;
      local_460 = local_27a0;
      uStack_458 = uStack_2798;
      local_470 = 0x3e4cceac3e4cceac;
      uStack_468 = 0x3e4cceac3e4cceac;
      local_410 = local_2820;
      uStack_408 = uStack_2818;
      local_420 = local_27a0;
      uStack_418 = uStack_2798;
      local_430 = (local_3c0 + -0.16668057) * (float)local_26f0;
      fStack_42c = (fStack_3bc + -0.16668057) * local_26f0._4_4_;
      fStack_428 = (fStack_3b8 + -0.16668057) * (float)uStack_26e8;
      fStack_424 = (fStack_3b4 + -0.16668057) * uStack_26e8._4_4_;
      local_440 = 0x3e4cceac3e4cceac;
      uStack_438 = 0x3e4cceac3e4cceac;
      local_2820._4_4_ = fStack_42c + 0.20000714;
      local_2820._0_4_ = local_430 + 0.20000714;
      uStack_2818._0_4_ = fStack_428 + 0.20000714;
      uStack_2818._4_4_ = fStack_424 + 0.20000714;
      local_4c0 = local_2820;
      uStack_4b8 = uStack_2818;
      local_4d0 = local_27a0;
      uStack_4c8 = uStack_2798;
      local_4e0 = 0xbe7ffffcbe7ffffc;
      uStack_4d8 = 0xbe7ffffcbe7ffffc;
      local_480 = local_2820;
      uStack_478 = uStack_2818;
      local_490 = local_27a0;
      uStack_488 = uStack_2798;
      local_4a0 = (local_430 + 0.20000714) * (float)local_26f0;
      fStack_49c = (fStack_42c + 0.20000714) * local_26f0._4_4_;
      fStack_498 = (fStack_428 + 0.20000714) * (float)uStack_26e8;
      fStack_494 = (fStack_424 + 0.20000714) * uStack_26e8._4_4_;
      local_4b0 = 0xbe7ffffcbe7ffffc;
      uStack_4a8 = 0xbe7ffffcbe7ffffc;
      local_2820._4_4_ = fStack_49c + -0.24999994;
      local_2820._0_4_ = local_4a0 + -0.24999994;
      uStack_2818._0_4_ = fStack_498 + -0.24999994;
      uStack_2818._4_4_ = fStack_494 + -0.24999994;
      local_530 = local_2820;
      uStack_528 = uStack_2818;
      local_540 = local_27a0;
      uStack_538 = uStack_2798;
      local_550 = 0x3eaaaaaa3eaaaaaa;
      uStack_548 = 0x3eaaaaaa3eaaaaaa;
      local_4f0 = local_2820;
      uStack_4e8 = uStack_2818;
      local_500 = local_27a0;
      uStack_4f8 = uStack_2798;
      local_510 = (local_4a0 + -0.24999994) * (float)local_26f0;
      fStack_50c = (fStack_49c + -0.24999994) * local_26f0._4_4_;
      fStack_508 = (fStack_498 + -0.24999994) * (float)uStack_26e8;
      fStack_504 = (fStack_494 + -0.24999994) * uStack_26e8._4_4_;
      local_520 = 0x3eaaaaaa3eaaaaaa;
      uStack_518 = 0x3eaaaaaa3eaaaaaa;
      local_2820._4_4_ = fStack_50c + 0.3333333;
      local_2820._0_4_ = local_510 + 0.3333333;
      uStack_2818._0_4_ = fStack_508 + 0.3333333;
      uStack_2818._4_4_ = fStack_504 + 0.3333333;
      local_900 = local_2820;
      uStack_8f8 = uStack_2818;
      local_910 = local_27a0;
      uStack_908 = uStack_2798;
      local_2820._0_4_ = (local_510 + 0.3333333) * (float)local_26f0;
      local_2820._4_4_ = (fStack_50c + 0.3333333) * local_26f0._4_4_;
      fVar67 = (fStack_508 + 0.3333333) * (float)uStack_26e8;
      fVar69 = (fStack_504 + 0.3333333) * uStack_26e8._4_4_;
      uStack_2818._0_4_ = fVar67;
      uStack_2818._4_4_ = fVar69;
      local_920 = local_2820;
      uStack_918 = uStack_2818;
      local_930 = CONCAT44(fStack_280c,local_2810);
      uStack_928 = CONCAT44(fStack_2804,fStack_2808);
      local_2820._0_4_ = (float)local_2820._0_4_ * local_2810;
      local_2820._4_4_ = (float)local_2820._4_4_ * fStack_280c;
      fVar67 = fVar67 * fStack_2808;
      fVar69 = fVar69 * fStack_2804;
      uStack_2818._0_4_ = fVar67;
      uStack_2818._4_4_ = fVar69;
      local_5c0 = local_2820;
      uStack_5b8 = uStack_2818;
      local_5a0._0_8_ = local_27e0;
      uVar15 = local_5a0._0_8_;
      local_5a0._8_8_ = local_27e0._8_8_;
      uVar16 = local_5a0._8_8_;
      local_570 = 0xb95e8083b95e8083;
      uStack_568 = 0xb95e8083b95e8083;
      local_560._0_4_ = local_27e0._0_4_;
      local_560._4_4_ = local_27e0._4_4_;
      uStack_558._0_4_ = local_27e0._8_4_;
      uStack_558._4_4_ = local_27e0._12_4_;
      local_580 = (float)local_560 * -0.00021219444;
      fStack_57c = local_560._4_4_ * -0.00021219444;
      fStack_578 = (float)uStack_558 * -0.00021219444;
      fStack_574 = uStack_558._4_4_ * -0.00021219444;
      local_590 = local_2820;
      uStack_588 = uStack_2818;
      local_2820._4_4_ = fStack_57c + (float)local_2820._4_4_;
      local_2820._0_4_ = local_580 + (float)local_2820._0_4_;
      uStack_2818._0_4_ = fStack_578 + fVar67;
      uStack_2818._4_4_ = fStack_574 + fVar69;
      local_d0 = CONCAT44(fStack_280c,local_2810);
      uStack_c8 = CONCAT44(fStack_2804,fStack_2808);
      local_f0 = local_2820;
      uStack_e8 = uStack_2818;
      local_b0 = local_2820;
      uStack_a8 = uStack_2818;
      local_a0 = 0x3f0000003f000000;
      uStack_98 = 0x3f0000003f000000;
      local_c0 = local_2810 * 0.5;
      fStack_bc = fStack_280c * 0.5;
      fStack_b8 = fStack_2808 * 0.5;
      fStack_b4 = fStack_2804 * 0.5;
      auVar63._8_8_ = uStack_2818;
      auVar63._0_8_ = local_2820;
      auVar62._4_4_ = fStack_bc;
      auVar62._0_4_ = local_c0;
      auVar62._8_4_ = fStack_b8;
      auVar62._12_4_ = fStack_b4;
      _local_2820 = vsubps_avx(auVar63,auVar62);
      local_2710 = local_27a0;
      uStack_2708 = uStack_2798;
      local_2720._0_4_ = local_2820._0_4_;
      local_2720._4_4_ = local_2820._4_4_;
      uStack_2718._0_4_ = local_2820._8_4_;
      uStack_2718._4_4_ = local_2820._12_4_;
      local_27a0._4_4_ = local_26f0._4_4_ + local_2720._4_4_;
      local_27a0._0_4_ = (float)local_26f0 + (float)local_2720;
      uStack_2798._0_4_ = (float)uStack_26e8 + (float)uStack_2718;
      uStack_2798._4_4_ = uStack_26e8._4_4_ + uStack_2718._4_4_;
      local_610 = local_5a0._0_8_;
      uStack_608 = local_5a0._8_8_;
      local_630 = local_27a0;
      uStack_628 = uStack_2798;
      local_5d0 = local_5a0._0_8_;
      uStack_5c8 = local_5a0._8_8_;
      local_5e0 = 0x3f3180003f318000;
      uStack_5d8 = 0x3f3180003f318000;
      local_5f0 = (float)local_560 * 0.6933594;
      fStack_5ec = local_560._4_4_ * 0.6933594;
      fStack_5e8 = (float)uStack_558 * 0.6933594;
      fStack_5e4 = uStack_558._4_4_ * 0.6933594;
      local_600 = local_27a0;
      uStack_5f8 = uStack_2798;
      local_27a0._4_4_ = fStack_5ec + local_26f0._4_4_ + local_2720._4_4_;
      local_27a0._0_4_ = local_5f0 + (float)local_26f0 + (float)local_2720;
      uStack_2798._0_4_ = fStack_5e8 + (float)uStack_26e8 + (float)uStack_2718;
      uStack_2798._4_4_ = fStack_5e4 + uStack_26e8._4_4_ + uStack_2718._4_4_;
      local_a00 = local_27a0;
      uStack_9f8 = uStack_2798;
      local_a10 = local_27d0._0_8_;
      uStack_a08 = local_27d0._8_8_;
      auVar56._8_8_ = uStack_2798;
      auVar56._0_8_ = local_27a0;
      _local_27a0 = vpor_avx(auVar56,local_27d0);
      local_31c0 = auVar4._0_8_;
      local_2860 = local_31c0;
      uStack_31b8 = auVar4._8_8_;
      uStack_2858 = uStack_31b8;
      auVar4 = vpand_avx(*(undefined1 (*) [16])*local_3040,auVar4);
      local_31f0 = auVar4._0_8_;
      uStack_31e8 = auVar4._8_8_;
      local_26b0._0_4_ = auVar4._0_4_;
      local_26b0._4_4_ = auVar4._4_4_;
      uStack_26a8._0_4_ = auVar4._8_4_;
      uStack_26a8._4_4_ = auVar4._12_4_;
      local_26c0._0_4_ = local_27a0._0_4_;
      local_26c0._4_4_ = local_27a0._4_4_;
      uStack_26b8._0_4_ = local_27a0._8_4_;
      uStack_26b8._4_4_ = local_27a0._12_4_;
      local_31b0 = CONCAT44(local_26b0._4_4_ + local_26c0._4_4_,
                            (float)local_26b0 + (float)local_26c0);
      uStack_31a8 = CONCAT44(uStack_26a8._4_4_ + uStack_26b8._4_4_,
                             (float)uStack_26a8 + (float)uStack_26b8);
      local_24d8 = local_3040;
      local_24f0 = local_31b0;
      uStack_24e8 = uStack_31a8;
      *(undefined8 *)*local_3040 = local_31b0;
      *(undefined8 *)(*local_3040 + 8) = uStack_31a8;
      local_3040 = (undefined1 (*) [32])(*local_3040 + 0x10);
      local_2850 = local_2870;
      uStack_2848 = uStack_2868;
      local_2830 = local_2870;
      uStack_2828 = uStack_2868;
      local_2720 = local_2820;
      uStack_2718 = uStack_2818;
      local_2700 = local_2800._0_8_;
      uStack_26f8 = local_2800._8_8_;
      local_26f0 = uVar13;
      uStack_26e8 = uVar14;
      local_26d0 = uVar11;
      uStack_26c8 = uVar12;
      local_26c0 = local_27a0;
      uStack_26b8 = uStack_2798;
      local_26b0 = local_31f0;
      uStack_26a8 = uStack_31e8;
      local_2690 = 0x3f8000003f800000;
      uStack_2688 = 0x3f8000003f800000;
      local_2650 = local_27c0;
      uStack_2648 = uStack_27b8;
      local_b00 = local_da0;
      uStack_af8 = uStack_d98;
      local_a70 = auVar77._0_8_;
      local_a30 = auVar77._0_8_;
      local_9f0 = local_2590;
      uStack_9e8 = uStack_2588;
      local_960 = local_970;
      uStack_958 = uStack_968;
      local_940 = uVar9;
      uStack_938 = uVar10;
      local_8e0 = local_8f0;
      uStack_8d8 = uStack_8e8;
      local_860 = local_2590;
      uStack_858 = uStack_2588;
      local_5a0 = _local_27e0;
      local_560 = uVar15;
      uStack_558 = uVar16;
      local_1c0 = local_5b0;
      uStack_1b8 = uStack_5a8;
      local_150 = local_620;
      uStack_148 = uStack_618;
      local_100 = local_2630;
      uStack_f8 = uStack_2628;
      local_e0 = local_2590;
      uStack_d8 = uStack_2588;
      local_90 = local_d0;
      uStack_88 = uStack_c8;
    }
    for (; local_28a0 = auVar4, local_3098 < local_3030; local_3098 = local_3098 + 1) {
      if (*(float *)*local_3040 <= 0.0) {
        dVar68 = std::exp((double)(ulong)*(uint *)*local_3040);
        dVar68 = std::log((double)(ulong)(uint)(SUB84(dVar68,0) + 1.0));
        *(int *)*local_3040 = SUB84(dVar68,0);
      }
      else {
        fVar67 = *(float *)*local_3040;
        dVar68 = std::exp((double)(ulong)(*(uint *)*local_3040 ^ 0x80000000));
        dVar68 = std::log((double)(ulong)(uint)(SUB84(dVar68,0) + 1.0));
        *(float *)*local_3040 = fVar67 + SUB84(dVar68,0);
      }
      local_3040 = (undefined1 (*) [32])(*local_3040 + 4);
      auVar4 = local_28a0;
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = static_cast<float>(*ptr + log(1.f + exp(-(*ptr))));
            else
                *ptr = static_cast<float>(log(1.f + exp(*ptr)));
            ptr++;
        }
    }
    return 0;
}